

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  long lVar78;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ulong uVar79;
  ulong uVar80;
  bool bVar81;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar135;
  uint uVar136;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float pp;
  float fVar142;
  float fVar143;
  undefined4 uVar144;
  float fVar160;
  float fVar161;
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar146 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar181;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar204;
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar218;
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar239;
  float fVar240;
  undefined1 auVar237 [16];
  float fVar241;
  undefined1 auVar238 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  float fVar246;
  undefined1 auVar244 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_928;
  int local_910;
  undefined2 local_90a;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  undefined4 local_888;
  uint local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined4 local_5f8;
  float local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  uint local_5e4;
  uint local_5e0;
  ulong local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  Primitive *local_450;
  ulong local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 auStack_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar124 [32];
  undefined1 auVar245 [64];
  
  PVar4 = prim[1];
  uVar83 = (ulong)(byte)PVar4;
  fVar205 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar204 = fVar205 * auVar90._0_4_;
  fVar142 = fVar205 * (ray->dir).field_0.m128[0];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar88);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar92);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar91);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar105 = vpmovsxbd_avx2(auVar85);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar83 + 6);
  auVar97 = vpmovsxbd_avx2(auVar89);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar79 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar79 + uVar83 + 6);
  auVar103 = vpmovsxbd_avx2(auVar243);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar249 = ZEXT3264(auVar103);
  uVar80 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar95 = vpmovsxbd_avx2(auVar3);
  auVar104 = vcvtdq2ps_avx(auVar95);
  auVar252 = ZEXT3264(auVar104);
  auVar116._4_4_ = fVar142;
  auVar116._0_4_ = fVar142;
  auVar116._8_4_ = fVar142;
  auVar116._12_4_ = fVar142;
  auVar116._16_4_ = fVar142;
  auVar116._20_4_ = fVar142;
  auVar116._24_4_ = fVar142;
  auVar116._28_4_ = fVar142;
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar107 = ZEXT1632(CONCAT412(fVar205 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar205 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar205 * (ray->dir).field_0.m128[1],fVar142))));
  auVar106 = vpermps_avx2(auVar118,auVar107);
  auVar94 = vpermps_avx512vl(auVar93,auVar107);
  fVar142 = auVar94._0_4_;
  fVar239 = auVar94._4_4_;
  auVar107._4_4_ = fVar239 * auVar99._4_4_;
  auVar107._0_4_ = fVar142 * auVar99._0_4_;
  fVar240 = auVar94._8_4_;
  auVar107._8_4_ = fVar240 * auVar99._8_4_;
  fVar241 = auVar94._12_4_;
  auVar107._12_4_ = fVar241 * auVar99._12_4_;
  fVar218 = auVar94._16_4_;
  auVar107._16_4_ = fVar218 * auVar99._16_4_;
  fVar219 = auVar94._20_4_;
  auVar107._20_4_ = fVar219 * auVar99._20_4_;
  fVar165 = auVar94._24_4_;
  auVar107._24_4_ = fVar165 * auVar99._24_4_;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar97._4_4_ * fVar239;
  auVar105._0_4_ = auVar97._0_4_ * fVar142;
  auVar105._8_4_ = auVar97._8_4_ * fVar240;
  auVar105._12_4_ = auVar97._12_4_ * fVar241;
  auVar105._16_4_ = auVar97._16_4_ * fVar218;
  auVar105._20_4_ = auVar97._20_4_ * fVar219;
  auVar105._24_4_ = auVar97._24_4_ * fVar165;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar104._4_4_ * fVar239;
  auVar95._0_4_ = auVar104._0_4_ * fVar142;
  auVar95._8_4_ = auVar104._8_4_ * fVar240;
  auVar95._12_4_ = auVar104._12_4_ * fVar241;
  auVar95._16_4_ = auVar104._16_4_ * fVar218;
  auVar95._20_4_ = auVar104._20_4_ * fVar219;
  auVar95._24_4_ = auVar104._24_4_ * fVar165;
  auVar95._28_4_ = auVar94._28_4_;
  auVar87 = vfmadd231ps_fma(auVar107,auVar106,auVar96);
  auVar88 = vfmadd231ps_fma(auVar105,auVar106,auVar101);
  auVar92 = vfmadd231ps_fma(auVar95,auVar103,auVar106);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar116,auVar98);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar116,auVar100);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar102,auVar116);
  auVar117._4_4_ = fVar204;
  auVar117._0_4_ = fVar204;
  auVar117._8_4_ = fVar204;
  auVar117._12_4_ = fVar204;
  auVar117._16_4_ = fVar204;
  auVar117._20_4_ = fVar204;
  auVar117._24_4_ = fVar204;
  auVar117._28_4_ = fVar204;
  auVar95 = ZEXT1632(CONCAT412(fVar205 * auVar90._12_4_,
                               CONCAT48(fVar205 * auVar90._8_4_,
                                        CONCAT44(fVar205 * auVar90._4_4_,fVar204))));
  auVar105 = vpermps_avx2(auVar118,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar205 = auVar95._0_4_;
  fVar142 = auVar95._4_4_;
  auVar106._4_4_ = fVar142 * auVar99._4_4_;
  auVar106._0_4_ = fVar205 * auVar99._0_4_;
  fVar239 = auVar95._8_4_;
  auVar106._8_4_ = fVar239 * auVar99._8_4_;
  fVar240 = auVar95._12_4_;
  auVar106._12_4_ = fVar240 * auVar99._12_4_;
  fVar241 = auVar95._16_4_;
  auVar106._16_4_ = fVar241 * auVar99._16_4_;
  fVar218 = auVar95._20_4_;
  auVar106._20_4_ = fVar218 * auVar99._20_4_;
  fVar219 = auVar95._24_4_;
  auVar106._24_4_ = fVar219 * auVar99._24_4_;
  auVar106._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar142;
  auVar93._0_4_ = auVar97._0_4_ * fVar205;
  auVar93._8_4_ = auVar97._8_4_ * fVar239;
  auVar93._12_4_ = auVar97._12_4_ * fVar240;
  auVar93._16_4_ = auVar97._16_4_ * fVar241;
  auVar93._20_4_ = auVar97._20_4_ * fVar218;
  auVar93._24_4_ = auVar97._24_4_ * fVar219;
  auVar93._28_4_ = auVar99._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar142;
  auVar97._0_4_ = auVar104._0_4_ * fVar205;
  auVar97._8_4_ = auVar104._8_4_ * fVar239;
  auVar97._12_4_ = auVar104._12_4_ * fVar240;
  auVar97._16_4_ = auVar104._16_4_ * fVar241;
  auVar97._20_4_ = auVar104._20_4_ * fVar218;
  auVar97._24_4_ = auVar104._24_4_ * fVar219;
  auVar97._28_4_ = auVar95._28_4_;
  auVar91 = vfmadd231ps_fma(auVar106,auVar105,auVar96);
  auVar85 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
  auVar89 = vfmadd231ps_fma(auVar97,auVar105,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar117,auVar98);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar117,auVar100);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar117,auVar102);
  auVar98 = vandps_avx(ZEXT1632(auVar87),auVar112);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar98,auVar115,1);
  bVar81 = (bool)((byte)uVar79 & 1);
  auVar94._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._0_4_;
  bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._4_4_;
  bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._8_4_;
  bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar88),auVar112);
  uVar79 = vcmpps_avx512vl(auVar98,auVar115,1);
  bVar81 = (bool)((byte)uVar79 & 1);
  auVar108._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar88._0_4_;
  bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar88._4_4_;
  bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar88._8_4_;
  bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar88._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar92),auVar112);
  uVar79 = vcmpps_avx512vl(auVar98,auVar115,1);
  bVar81 = (bool)((byte)uVar79 & 1);
  auVar98._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar92._0_4_;
  bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar92._4_4_;
  bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar92._8_4_;
  bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar92._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar94,auVar96,auVar114);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar108);
  auVar88 = vfnmadd213ps_fma(auVar108,auVar96,auVar114);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar92 = vfnmadd213ps_fma(auVar98,auVar96,auVar114);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar91));
  auVar102._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar91));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar111._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar111._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar111._16_4_ = auVar98._16_4_ * 0.0;
  auVar111._20_4_ = auVar98._20_4_ * 0.0;
  auVar111._24_4_ = auVar98._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar83 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
  auVar103._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
  auVar110._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + uVar83 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar89));
  auVar104._4_4_ = auVar98._4_4_ * auVar92._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar92._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar92._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar92._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar89));
  auVar109._0_4_ = auVar92._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar92._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar92._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar92._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar111);
  auVar96 = vpminsd_avx2(auVar103,auVar110);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar109);
  uVar144 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar99._4_4_ = uVar144;
  auVar99._0_4_ = uVar144;
  auVar99._8_4_ = uVar144;
  auVar99._12_4_ = uVar144;
  auVar99._16_4_ = uVar144;
  auVar99._20_4_ = uVar144;
  auVar99._24_4_ = uVar144;
  auVar99._28_4_ = uVar144;
  auVar96 = vmaxps_avx512vl(auVar96,auVar99);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar111);
  auVar96 = vpmaxsd_avx2(auVar103,auVar110);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar109);
  fVar205 = ray->tfar;
  auVar100._4_4_ = fVar205;
  auVar100._0_4_ = fVar205;
  auVar100._8_4_ = fVar205;
  auVar100._12_4_ = fVar205;
  auVar100._16_4_ = fVar205;
  auVar100._20_4_ = fVar205;
  auVar100._24_4_ = fVar205;
  auVar100._28_4_ = fVar205;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar19 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_280,auVar98,2);
  if ((byte)((byte)uVar17 & (byte)uVar19) == 0) {
    return false;
  }
  local_448 = (ulong)(byte)((byte)uVar17 & (byte)uVar19);
  local_450 = prim;
LAB_01d67f7d:
  lVar78 = 0;
  for (uVar79 = local_448; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  local_908 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_5c8 = (ulong)*(uint *)(prim + lVar78 * 4 + 6);
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar78 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar78 = *(long *)&pGVar5[1].time_range.upper;
  auVar87 = *(undefined1 (*) [16])(lVar78 + (long)p_Var6 * uVar79);
  auVar88 = *(undefined1 (*) [16])(lVar78 + (uVar79 + 1) * (long)p_Var6);
  auVar92 = *(undefined1 (*) [16])(lVar78 + (uVar79 + 2) * (long)p_Var6);
  local_448 = local_448 - 1 & local_448;
  auVar91 = *(undefined1 (*) [16])(lVar78 + (uVar79 + 3) * (long)p_Var6);
  if (local_448 != 0) {
    uVar80 = local_448 - 1 & local_448;
    for (uVar79 = local_448; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar80 != 0) {
      for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar224._0_4_ = auVar87._0_4_ + auVar88._0_4_ + auVar92._0_4_ + auVar91._0_4_;
  auVar224._4_4_ = auVar87._4_4_ + auVar88._4_4_ + auVar92._4_4_ + auVar91._4_4_;
  auVar224._8_4_ = auVar87._8_4_ + auVar88._8_4_ + auVar92._8_4_ + auVar91._8_4_;
  auVar224._12_4_ = auVar87._12_4_ + auVar88._12_4_ + auVar92._12_4_ + auVar91._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar90._8_4_ = 0x3e800000;
  auVar90._0_8_ = 0x3e8000003e800000;
  auVar90._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar224,auVar90);
  auVar85 = vsubps_avx(auVar85,(undefined1  [16])aVar1);
  auVar85 = vdpps_avx(auVar85,(undefined1  [16])aVar2,0x7f);
  auVar89 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar243 = ZEXT816(0) << 0x40;
  auVar245 = ZEXT1664(auVar243);
  auVar237._4_12_ = ZEXT812(0) << 0x20;
  auVar237._0_4_ = auVar89._0_4_;
  auVar86 = vrcp14ss_avx512f(auVar243,auVar237);
  auVar89 = vfnmadd213ss_fma(auVar86,auVar89,ZEXT416(0x40000000));
  auVar242 = ZEXT1664(auVar89);
  fVar205 = auVar85._0_4_ * auVar86._0_4_ * auVar89._0_4_;
  local_4b0 = ZEXT416((uint)fVar205);
  auVar225._4_4_ = fVar205;
  auVar225._0_4_ = fVar205;
  auVar225._8_4_ = fVar205;
  auVar225._12_4_ = fVar205;
  fStack_8d0 = fVar205;
  _local_8e0 = auVar225;
  fStack_8cc = fVar205;
  fStack_8c8 = fVar205;
  fStack_8c4 = fVar205;
  auVar85 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar225);
  auVar85 = vblendps_avx(auVar85,auVar243,8);
  auVar87 = vsubps_avx(auVar87,auVar85);
  auVar92 = vsubps_avx(auVar92,auVar85);
  uVar144 = *(undefined4 *)&(ray->dir).field_0;
  local_340._4_4_ = uVar144;
  local_340._0_4_ = uVar144;
  local_340._8_4_ = uVar144;
  local_340._12_4_ = uVar144;
  local_340._16_4_ = uVar144;
  local_340._20_4_ = uVar144;
  local_340._24_4_ = uVar144;
  local_340._28_4_ = uVar144;
  auVar238 = ZEXT3264(local_340);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar262 = ZEXT3264(local_640);
  local_3c0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  auVar88 = vsubps_avx(auVar88,auVar85);
  auVar236 = ZEXT1664(auVar88);
  auVar91 = vsubps_avx(auVar91,auVar85);
  auVar229 = ZEXT1664(auVar91);
  local_7e0 = vbroadcastss_avx512vl(auVar87);
  auVar260 = ZEXT3264(local_7e0);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_520 = ZEXT1632(auVar87);
  local_800 = vpermps_avx512vl(auVar120,local_520);
  auVar254 = ZEXT3264(local_800);
  auVar123._8_4_ = 2;
  auVar123._0_8_ = 0x200000002;
  auVar123._12_4_ = 2;
  auVar123._16_4_ = 2;
  auVar123._20_4_ = 2;
  auVar123._24_4_ = 2;
  auVar123._28_4_ = 2;
  local_6a0 = vpermps_avx512vl(auVar123,local_520);
  auVar255 = ZEXT3264(local_6a0);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  local_6c0 = vpermps_avx512vl(auVar124,local_520);
  auVar256 = ZEXT3264(local_6c0);
  local_820 = vbroadcastss_avx512vl(auVar88);
  auVar257 = ZEXT3264(local_820);
  local_560 = ZEXT1632(auVar88);
  local_6e0 = vpermps_avx512vl(auVar120,local_560);
  auVar258 = ZEXT3264(local_6e0);
  local_840 = vpermps_avx512vl(auVar123,local_560);
  auVar259 = ZEXT3264(local_840);
  local_700 = vpermps_avx512vl(auVar124,local_560);
  auVar261 = ZEXT3264(local_700);
  local_860 = vbroadcastss_avx512vl(auVar92);
  auVar263 = ZEXT3264(local_860);
  local_540 = ZEXT1632(auVar92);
  local_720 = vpermps_avx512vl(auVar120,local_540);
  auVar264 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar123,local_540);
  auVar265 = ZEXT3264(local_740);
  local_7c0 = vpermps_avx512vl(auVar124,local_540);
  auVar266 = ZEXT3264(local_7c0);
  local_880 = vbroadcastss_avx512vl(auVar91);
  auVar267 = ZEXT3264(local_880);
  _local_580 = ZEXT1632(auVar91);
  _local_1e0 = vpermps_avx2(auVar120,_local_580);
  local_240 = vpermps_avx2(auVar123,_local_580);
  local_260 = vpermps_avx512vl(auVar124,_local_580);
  auVar98 = vpermps_avx2(auVar123,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar98,local_640,local_640);
  auVar87 = vfmadd231ps_fma(local_220,local_340,local_340);
  local_200 = ZEXT1632(auVar87);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar87),auVar119);
  local_928 = 1;
  uVar79 = 0;
  bVar81 = false;
  local_370 = ZEXT816(0x3f80000000000000);
  auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar87 = vmovshdup_avx(local_370);
    auVar87 = vsubps_avx(auVar87,local_370);
    auVar145._0_4_ = auVar87._0_4_;
    fVar16 = auVar145._0_4_ * 0.04761905;
    uVar144 = local_370._0_4_;
    local_620._4_4_ = uVar144;
    local_620._0_4_ = uVar144;
    local_620._8_4_ = uVar144;
    local_620._12_4_ = uVar144;
    local_620._16_4_ = uVar144;
    local_620._20_4_ = uVar144;
    local_620._24_4_ = uVar144;
    local_620._28_4_ = uVar144;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    local_7a0._16_4_ = auVar145._0_4_;
    local_7a0._0_16_ = auVar145;
    local_7a0._20_4_ = auVar145._0_4_;
    local_7a0._24_4_ = auVar145._0_4_;
    local_7a0._28_4_ = auVar145._0_4_;
    auVar87 = vfmadd231ps_fma(local_620,local_7a0,_DAT_01faff20);
    auVar98 = vsubps_avx(auVar231._0_32_,ZEXT1632(auVar87));
    fVar142 = auVar98._0_4_;
    fVar240 = auVar98._4_4_;
    fVar218 = auVar98._8_4_;
    fVar165 = auVar98._12_4_;
    fVar181 = auVar98._16_4_;
    fVar14 = auVar98._20_4_;
    fVar15 = auVar98._24_4_;
    fVar143 = fVar142 * fVar142 * fVar142;
    fVar160 = fVar240 * fVar240 * fVar240;
    auVar38._4_4_ = fVar160;
    auVar38._0_4_ = fVar143;
    fVar161 = fVar218 * fVar218 * fVar218;
    auVar38._8_4_ = fVar161;
    fVar162 = fVar165 * fVar165 * fVar165;
    auVar38._12_4_ = fVar162;
    fVar163 = fVar181 * fVar181 * fVar181;
    auVar38._16_4_ = fVar163;
    fVar164 = fVar14 * fVar14 * fVar14;
    auVar38._20_4_ = fVar164;
    fVar166 = fVar15 * fVar15 * fVar15;
    auVar38._24_4_ = fVar166;
    auVar38._28_4_ = auVar145._0_4_;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar38,auVar96);
    fVar239 = auVar87._0_4_;
    fVar241 = auVar87._4_4_;
    fVar219 = auVar87._8_4_;
    fVar204 = auVar87._12_4_;
    fVar180 = fVar239 * fVar239 * fVar239;
    fVar201 = fVar241 * fVar241 * fVar241;
    fVar202 = fVar219 * fVar219 * fVar219;
    fVar203 = fVar204 * fVar204 * fVar204;
    auVar231._0_4_ = fVar239 * fVar142;
    auVar231._4_4_ = fVar241 * fVar240;
    auVar231._8_4_ = fVar219 * fVar218;
    auVar231._12_4_ = fVar204 * fVar165;
    auVar231._16_4_ = fVar181 * 0.0;
    auVar231._20_4_ = fVar14 * 0.0;
    auVar231._28_36_ = auVar242._28_36_;
    auVar231._24_4_ = fVar15 * 0.0;
    fVar205 = auVar252._28_4_;
    auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar203,CONCAT48(fVar202,CONCAT44(fVar201,fVar180)
                                                                  ))),auVar96);
    fVar246 = auVar100._28_4_ + auVar145._0_4_;
    auVar39._4_4_ = fVar160 * 0.16666667;
    auVar39._0_4_ = fVar143 * 0.16666667;
    auVar39._8_4_ = fVar161 * 0.16666667;
    auVar39._12_4_ = fVar162 * 0.16666667;
    auVar39._16_4_ = fVar163 * 0.16666667;
    auVar39._20_4_ = fVar164 * 0.16666667;
    auVar39._24_4_ = fVar166 * 0.16666667;
    auVar39._28_4_ = fVar246;
    auVar40._4_4_ =
         (auVar231._4_4_ * fVar240 * 12.0 + auVar231._4_4_ * fVar241 * 6.0 + fVar201 + auVar99._4_4_
         ) * 0.16666667;
    auVar40._0_4_ =
         (auVar231._0_4_ * fVar142 * 12.0 + auVar231._0_4_ * fVar239 * 6.0 + fVar180 + auVar99._0_4_
         ) * 0.16666667;
    auVar40._8_4_ =
         (auVar231._8_4_ * fVar218 * 12.0 + auVar231._8_4_ * fVar219 * 6.0 + fVar202 + auVar99._8_4_
         ) * 0.16666667;
    auVar40._12_4_ =
         (auVar231._12_4_ * fVar165 * 12.0 + auVar231._12_4_ * fVar204 * 6.0 +
         fVar203 + auVar99._12_4_) * 0.16666667;
    auVar40._16_4_ =
         (auVar231._16_4_ * fVar181 * 12.0 + auVar231._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar40._20_4_ =
         (auVar231._20_4_ * fVar14 * 12.0 + auVar231._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar40._24_4_ =
         (auVar231._24_4_ * fVar15 * 12.0 + auVar231._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar40._28_4_ = auVar249._28_4_;
    auVar41._4_4_ =
         (auVar100._4_4_ + fVar160 +
         auVar231._4_4_ * fVar241 * 12.0 + auVar231._4_4_ * fVar240 * 6.0) * 0.16666667;
    auVar41._0_4_ =
         (auVar100._0_4_ + fVar143 +
         auVar231._0_4_ * fVar239 * 12.0 + auVar231._0_4_ * fVar142 * 6.0) * 0.16666667;
    auVar41._8_4_ =
         (auVar100._8_4_ + fVar161 +
         auVar231._8_4_ * fVar219 * 12.0 + auVar231._8_4_ * fVar218 * 6.0) * 0.16666667;
    auVar41._12_4_ =
         (auVar100._12_4_ + fVar162 +
         auVar231._12_4_ * fVar204 * 12.0 + auVar231._12_4_ * fVar165 * 6.0) * 0.16666667;
    auVar41._16_4_ =
         (auVar100._16_4_ + fVar163 + auVar231._16_4_ * 0.0 * 12.0 + auVar231._16_4_ * fVar181 * 6.0
         ) * 0.16666667;
    auVar41._20_4_ =
         (auVar100._20_4_ + fVar164 + auVar231._20_4_ * 0.0 * 12.0 + auVar231._20_4_ * fVar14 * 6.0)
         * 0.16666667;
    auVar41._24_4_ =
         (auVar100._24_4_ + fVar166 + auVar231._24_4_ * 0.0 * 12.0 + auVar231._24_4_ * fVar15 * 6.0)
         * 0.16666667;
    auVar41._28_4_ = fVar205;
    fVar180 = fVar180 * 0.16666667;
    fVar201 = fVar201 * 0.16666667;
    fVar202 = fVar202 * 0.16666667;
    fVar203 = fVar203 * 0.16666667;
    auVar42._28_4_ = fVar246 + auVar249._28_4_ + auVar229._28_4_;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar203,CONCAT48(fVar202,CONCAT44(fVar201,fVar180))));
    auVar100 = vmulps_avx512vl(auVar267._0_32_,auVar42);
    auVar43._4_4_ = (float)local_1e0._4_4_ * fVar201;
    auVar43._0_4_ = (float)local_1e0._0_4_ * fVar180;
    auVar43._8_4_ = fStack_1d8 * fVar202;
    auVar43._12_4_ = fStack_1d4 * fVar203;
    auVar43._16_4_ = fStack_1d0 * 0.0;
    auVar43._20_4_ = fStack_1cc * 0.0;
    auVar43._24_4_ = fStack_1c8 * 0.0;
    auVar43._28_4_ = auVar245._28_4_ + fVar205 + auVar99._28_4_ + 0.0;
    auVar44._4_4_ = local_240._4_4_ * fVar201;
    auVar44._0_4_ = local_240._0_4_ * fVar180;
    auVar44._8_4_ = local_240._8_4_ * fVar202;
    auVar44._12_4_ = local_240._12_4_ * fVar203;
    auVar44._16_4_ = local_240._16_4_ * 0.0;
    auVar44._20_4_ = local_240._20_4_ * 0.0;
    auVar44._24_4_ = local_240._24_4_ * 0.0;
    auVar44._28_4_ = auVar145._0_4_;
    auVar99 = vmulps_avx512vl(local_260,auVar42);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,auVar263._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar264._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar265._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar266._0_32_,auVar41);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,auVar257._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,auVar258._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar40,auVar259._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar261._0_32_,auVar40);
    auVar102 = vfmadd231ps_avx512vl(auVar100,auVar39,auVar260._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar39,auVar254._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar97,auVar39,auVar255._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar256._0_32_,auVar39);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar100 = vxorps_avx512vl(auVar98,auVar105);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar87),auVar105);
    auVar222._0_4_ = auVar101._0_4_ * fVar239;
    auVar222._4_4_ = auVar101._4_4_ * fVar241;
    auVar222._8_4_ = auVar101._8_4_ * fVar219;
    auVar222._12_4_ = auVar101._12_4_ * fVar204;
    auVar222._16_4_ = auVar101._16_4_ * 0.0;
    auVar222._20_4_ = auVar101._20_4_ * 0.0;
    auVar222._24_4_ = auVar101._24_4_ * 0.0;
    auVar222._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar231._0_32_,auVar96);
    auVar96 = vsubps_avx(auVar222,auVar97);
    auVar45._4_4_ = auVar100._4_4_ * fVar240 * 0.5;
    auVar45._0_4_ = auVar100._0_4_ * fVar142 * 0.5;
    auVar45._8_4_ = auVar100._8_4_ * fVar218 * 0.5;
    auVar45._12_4_ = auVar100._12_4_ * fVar165 * 0.5;
    auVar45._16_4_ = auVar100._16_4_ * fVar181 * 0.5;
    auVar45._20_4_ = auVar100._20_4_ * fVar14 * 0.5;
    auVar45._24_4_ = auVar100._24_4_ * fVar15 * 0.5;
    auVar45._28_4_ = auVar98._28_4_;
    auVar46._4_4_ = auVar96._4_4_ * 0.5;
    auVar46._0_4_ = auVar96._0_4_ * 0.5;
    auVar46._8_4_ = auVar96._8_4_ * 0.5;
    auVar46._12_4_ = auVar96._12_4_ * 0.5;
    auVar46._16_4_ = auVar96._16_4_ * 0.5;
    auVar46._20_4_ = auVar96._20_4_ * 0.5;
    auVar46._24_4_ = auVar96._24_4_ * 0.5;
    auVar46._28_4_ = auVar96._28_4_;
    auVar47._4_4_ = (auVar97._4_4_ + fVar240 * fVar240) * 0.5;
    auVar47._0_4_ = (auVar97._0_4_ + fVar142 * fVar142) * 0.5;
    auVar47._8_4_ = (auVar97._8_4_ + fVar218 * fVar218) * 0.5;
    auVar47._12_4_ = (auVar97._12_4_ + fVar165 * fVar165) * 0.5;
    auVar47._16_4_ = (auVar97._16_4_ + fVar181 * fVar181) * 0.5;
    auVar47._20_4_ = (auVar97._20_4_ + fVar14 * fVar14) * 0.5;
    auVar47._24_4_ = (auVar97._24_4_ + fVar15 * fVar15) * 0.5;
    auVar47._28_4_ = auVar97._28_4_ + auVar236._28_4_;
    fVar142 = fVar239 * fVar239 * 0.5;
    fVar239 = fVar241 * fVar241 * 0.5;
    fVar240 = fVar219 * fVar219 * 0.5;
    fVar241 = fVar204 * fVar204 * 0.5;
    auVar48._28_4_ = auVar238._28_4_;
    auVar48._0_28_ = ZEXT1628(CONCAT412(fVar241,CONCAT48(fVar240,CONCAT44(fVar239,fVar142))));
    auVar49._4_4_ = auVar267._4_4_ * fVar239;
    auVar49._0_4_ = auVar267._0_4_ * fVar142;
    auVar49._8_4_ = auVar267._8_4_ * fVar240;
    auVar49._12_4_ = auVar267._12_4_ * fVar241;
    auVar49._16_4_ = auVar267._16_4_ * 0.0;
    auVar49._20_4_ = auVar267._20_4_ * 0.0;
    auVar49._24_4_ = auVar267._24_4_ * 0.0;
    auVar49._28_4_ = 0x3f000000;
    auVar50._4_4_ = (float)local_1e0._4_4_ * fVar239;
    auVar50._0_4_ = (float)local_1e0._0_4_ * fVar142;
    auVar50._8_4_ = fStack_1d8 * fVar240;
    auVar50._12_4_ = fStack_1d4 * fVar241;
    auVar50._16_4_ = fStack_1d0 * 0.0;
    auVar50._20_4_ = fStack_1cc * 0.0;
    auVar50._24_4_ = fStack_1c8 * 0.0;
    auVar50._28_4_ = auVar101._28_4_;
    auVar51._4_4_ = fVar239 * local_240._4_4_;
    auVar51._0_4_ = fVar142 * local_240._0_4_;
    auVar51._8_4_ = fVar240 * local_240._8_4_;
    auVar51._12_4_ = fVar241 * local_240._12_4_;
    auVar51._16_4_ = local_240._16_4_ * 0.0;
    auVar51._20_4_ = local_240._20_4_ * 0.0;
    auVar51._24_4_ = local_240._24_4_ * 0.0;
    auVar51._28_4_ = uStack_1c4;
    auVar98 = vmulps_avx512vl(local_260,auVar48);
    auVar96 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar263._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar264._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar51,auVar47,auVar265._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar266._0_32_,auVar47);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar46,auVar257._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar46,auVar258._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar46,auVar259._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar261._0_32_,auVar46);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar45,auVar260._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar45,auVar254._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar45,auVar255._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar256._0_32_,auVar45);
    auVar52._4_4_ = auVar96._4_4_ * fVar16;
    auVar52._0_4_ = auVar96._0_4_ * fVar16;
    auVar52._8_4_ = auVar96._8_4_ * fVar16;
    auVar52._12_4_ = auVar96._12_4_ * fVar16;
    auVar52._16_4_ = auVar96._16_4_ * fVar16;
    auVar52._20_4_ = auVar96._20_4_ * fVar16;
    auVar52._24_4_ = auVar96._24_4_ * fVar16;
    auVar52._28_4_ = auVar267._28_4_;
    auVar249 = ZEXT3264(auVar52);
    auVar53._4_4_ = auVar100._4_4_ * fVar16;
    auVar53._0_4_ = auVar100._0_4_ * fVar16;
    auVar53._8_4_ = auVar100._8_4_ * fVar16;
    auVar53._12_4_ = auVar100._12_4_ * fVar16;
    auVar53._16_4_ = auVar100._16_4_ * fVar16;
    auVar53._20_4_ = auVar100._20_4_ * fVar16;
    auVar53._24_4_ = auVar100._24_4_ * fVar16;
    auVar53._28_4_ = fVar205;
    auVar252 = ZEXT3264(auVar53);
    auVar54._4_4_ = auVar101._4_4_ * fVar16;
    auVar54._0_4_ = auVar101._0_4_ * fVar16;
    auVar54._8_4_ = auVar101._8_4_ * fVar16;
    auVar54._12_4_ = auVar101._12_4_ * fVar16;
    auVar54._16_4_ = auVar101._16_4_ * fVar16;
    auVar54._20_4_ = auVar101._20_4_ * fVar16;
    auVar54._24_4_ = auVar101._24_4_ * fVar16;
    auVar54._28_4_ = auVar101._28_4_;
    fVar205 = auVar98._0_4_ * fVar16;
    fVar142 = auVar98._4_4_ * fVar16;
    auVar55._4_4_ = fVar142;
    auVar55._0_4_ = fVar205;
    fVar239 = auVar98._8_4_ * fVar16;
    auVar55._8_4_ = fVar239;
    fVar240 = auVar98._12_4_ * fVar16;
    auVar55._12_4_ = fVar240;
    fVar241 = auVar98._16_4_ * fVar16;
    auVar55._16_4_ = fVar241;
    fVar218 = auVar98._20_4_ * fVar16;
    auVar55._20_4_ = fVar218;
    fVar219 = auVar98._24_4_ * fVar16;
    auVar55._24_4_ = fVar219;
    auVar55._28_4_ = fVar16;
    auVar87 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
    auVar95 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,ZEXT1632(auVar87));
    auVar238 = ZEXT3264(auVar95);
    auVar106 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,ZEXT1632(auVar87));
    auVar242 = ZEXT3264(auVar106);
    auVar100 = ZEXT1632(auVar87);
    auVar107 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,auVar100);
    auVar245 = ZEXT3264(auVar107);
    auVar223._0_4_ = fVar205 + auVar99._0_4_;
    auVar223._4_4_ = fVar142 + auVar99._4_4_;
    auVar223._8_4_ = fVar239 + auVar99._8_4_;
    auVar223._12_4_ = fVar240 + auVar99._12_4_;
    auVar223._16_4_ = fVar241 + auVar99._16_4_;
    auVar223._20_4_ = fVar218 + auVar99._20_4_;
    auVar223._24_4_ = fVar219 + auVar99._24_4_;
    auVar223._28_4_ = fVar16 + auVar99._28_4_;
    auVar98 = vmaxps_avx(auVar99,auVar223);
    auVar96 = vminps_avx(auVar99,auVar223);
    auVar93 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar100);
    auVar94 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar100);
    auVar108 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar100);
    auVar119 = ZEXT1632(auVar87);
    auVar109 = vpermt2ps_avx512vl(auVar54,_DAT_01feed00,auVar119);
    auVar99 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,auVar119);
    auVar99 = vsubps_avx(auVar93,auVar99);
    auVar100 = vsubps_avx(auVar95,auVar102);
    auVar101 = vsubps_avx(auVar106,auVar103);
    auVar97 = vsubps_avx(auVar107,auVar104);
    auVar229 = ZEXT3264(auVar97);
    auVar110 = vmulps_avx512vl(auVar101,auVar54);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar53,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar52);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar54,auVar100);
    auVar112 = vmulps_avx512vl(auVar100,auVar53);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar52,auVar101);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar97,auVar97);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar101);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,auVar100);
    auVar112 = vrcp14ps_avx512vl(auVar111);
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar114 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar113);
    auVar112 = vfmadd132ps_avx512vl(auVar114,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar112);
    auVar114 = vmulps_avx512vl(auVar101,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar94);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar100);
    auVar116 = vmulps_avx512vl(auVar100,auVar108);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar94,auVar101);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar110 = vmaxps_avx512vl(auVar110,auVar112);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar112 = vmaxps_avx512vl(auVar99,auVar93);
    auVar98 = vmaxps_avx512vl(auVar98,auVar112);
    auVar112 = vaddps_avx512vl(auVar110,auVar98);
    auVar98 = vminps_avx(auVar99,auVar93);
    auVar98 = vminps_avx(auVar96,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar110);
    auVar28._8_4_ = 0x3f800002;
    auVar28._0_8_ = 0x3f8000023f800002;
    auVar28._12_4_ = 0x3f800002;
    auVar28._16_4_ = 0x3f800002;
    auVar28._20_4_ = 0x3f800002;
    auVar28._24_4_ = 0x3f800002;
    auVar28._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar112,auVar28);
    auVar29._8_4_ = 0x3f7ffffc;
    auVar29._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar29._12_4_ = 0x3f7ffffc;
    auVar29._16_4_ = 0x3f7ffffc;
    auVar29._20_4_ = 0x3f7ffffc;
    auVar29._24_4_ = 0x3f7ffffc;
    auVar29._28_4_ = 0x3f7ffffc;
    local_900 = vmulps_avx512vl(auVar98,auVar29);
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar96 = vrsqrt14ps_avx512vl(auVar111);
    auVar30._8_4_ = 0xbf000000;
    auVar30._0_8_ = 0xbf000000bf000000;
    auVar30._12_4_ = 0xbf000000;
    auVar30._16_4_ = 0xbf000000;
    auVar30._20_4_ = 0xbf000000;
    auVar30._24_4_ = 0xbf000000;
    auVar30._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar111,auVar30);
    fVar205 = auVar96._0_4_;
    fVar142 = auVar96._4_4_;
    fVar239 = auVar96._8_4_;
    fVar240 = auVar96._12_4_;
    fVar241 = auVar96._16_4_;
    fVar218 = auVar96._20_4_;
    fVar219 = auVar96._24_4_;
    auVar56._4_4_ = fVar142 * fVar142 * fVar142 * auVar99._4_4_;
    auVar56._0_4_ = fVar205 * fVar205 * fVar205 * auVar99._0_4_;
    auVar56._8_4_ = fVar239 * fVar239 * fVar239 * auVar99._8_4_;
    auVar56._12_4_ = fVar240 * fVar240 * fVar240 * auVar99._12_4_;
    auVar56._16_4_ = fVar241 * fVar241 * fVar241 * auVar99._16_4_;
    auVar56._20_4_ = fVar218 * fVar218 * fVar218 * auVar99._20_4_;
    auVar56._24_4_ = fVar219 * fVar219 * fVar219 * auVar99._24_4_;
    auVar56._28_4_ = auVar112._28_4_;
    auVar31._8_4_ = 0x3fc00000;
    auVar31._0_8_ = 0x3fc000003fc00000;
    auVar31._12_4_ = 0x3fc00000;
    auVar31._16_4_ = 0x3fc00000;
    auVar31._20_4_ = 0x3fc00000;
    auVar31._24_4_ = 0x3fc00000;
    auVar31._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar56,auVar96,auVar31);
    auVar99 = vmulps_avx512vl(auVar100,auVar96);
    auVar93 = vmulps_avx512vl(auVar101,auVar96);
    auVar110 = vmulps_avx512vl(auVar97,auVar96);
    auVar111 = vsubps_avx512vl(auVar119,auVar102);
    auVar112 = vsubps_avx512vl(auVar119,auVar103);
    auVar114 = vsubps_avx512vl(auVar119,auVar104);
    auVar69._4_4_ = uStack_3bc;
    auVar69._0_4_ = local_3c0;
    auVar69._8_4_ = uStack_3b8;
    auVar69._12_4_ = uStack_3b4;
    auVar69._16_4_ = uStack_3b0;
    auVar69._20_4_ = uStack_3ac;
    auVar69._24_4_ = uStack_3a8;
    auVar69._28_4_ = uStack_3a4;
    auVar115 = vmulps_avx512vl(auVar69,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar262._0_32_,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_340,auVar111);
    auVar116 = vmulps_avx512vl(auVar114,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar111);
    auVar117 = vmulps_avx512vl(auVar69,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar93,auVar262._0_32_);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar99,local_340);
    auVar110 = vmulps_avx512vl(auVar114,auVar110);
    auVar93 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar93,auVar111,auVar99);
    auVar93 = vmulps_avx512vl(auVar117,auVar117);
    auVar110 = vsubps_avx512vl(local_200,auVar93);
    auVar118 = vmulps_avx512vl(auVar117,auVar99);
    auVar115 = vsubps_avx512vl(auVar115,auVar118);
    auVar115 = vaddps_avx512vl(auVar115,auVar115);
    auVar118 = vmulps_avx512vl(auVar99,auVar99);
    local_5a0 = vsubps_avx512vl(auVar116,auVar118);
    auVar98 = vsubps_avx512vl(local_5a0,auVar98);
    local_4e0 = vmulps_avx512vl(auVar115,auVar115);
    auVar32._8_4_ = 0x40800000;
    auVar32._0_8_ = 0x4080000040800000;
    auVar32._12_4_ = 0x40800000;
    auVar32._16_4_ = 0x40800000;
    auVar32._20_4_ = 0x40800000;
    auVar32._24_4_ = 0x40800000;
    auVar32._28_4_ = 0x40800000;
    _local_500 = vmulps_avx512vl(auVar110,auVar32);
    auVar116 = vmulps_avx512vl(_local_500,auVar98);
    auVar116 = vsubps_avx512vl(local_4e0,auVar116);
    uVar80 = vcmpps_avx512vl(auVar116,auVar119,5);
    bVar74 = (byte)uVar80;
    if (bVar74 == 0) {
LAB_01d68d1d:
      auVar262 = ZEXT3264(local_640);
      auVar266 = ZEXT3264(local_7c0);
      auVar265 = ZEXT3264(local_740);
      auVar264 = ZEXT3264(local_720);
      auVar263 = ZEXT3264(local_860);
      auVar261 = ZEXT3264(local_700);
      auVar260 = ZEXT3264(local_7e0);
      auVar259 = ZEXT3264(local_840);
      auVar258 = ZEXT3264(local_6e0);
      auVar257 = ZEXT3264(local_820);
      auVar256 = ZEXT3264(local_6c0);
      auVar255 = ZEXT3264(local_6a0);
      auVar254 = ZEXT3264(local_800);
      auVar236 = ZEXT3264(_local_8e0);
      auVar231 = ZEXT3264(auVar113);
      auVar267 = ZEXT3264(local_880);
    }
    else {
      auVar118 = _local_500;
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar119 = vaddps_avx512vl(auVar110,auVar110);
      local_400 = vrcp14ps_avx512vl(auVar119);
      auVar120 = vfnmadd213ps_avx512vl(local_400,auVar119,auVar113);
      auVar120 = vfmadd132ps_avx512vl(auVar120,local_400,local_400);
      local_680 = vxorps_avx512vl(auVar115,auVar105);
      auVar105 = vsubps_avx512vl(local_680,auVar116);
      auVar105 = vmulps_avx512vl(auVar105,auVar120);
      auVar116 = vsubps_avx512vl(auVar116,auVar115);
      local_660 = vmulps_avx512vl(auVar116,auVar120);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar116,auVar105);
      auVar121._0_4_ =
           (uint)(bVar74 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar120._0_4_;
      bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar82 * auVar116._4_4_ | (uint)!bVar82 * auVar120._4_4_;
      bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar82 * auVar116._8_4_ | (uint)!bVar82 * auVar120._8_4_;
      bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar82 * auVar116._12_4_ | (uint)!bVar82 * auVar120._12_4_;
      bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar82 * auVar116._16_4_ | (uint)!bVar82 * auVar120._16_4_;
      bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar82 * auVar116._20_4_ | (uint)!bVar82 * auVar120._20_4_;
      bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar82 * auVar116._24_4_ | (uint)!bVar82 * auVar120._24_4_;
      bVar82 = SUB81(uVar80 >> 7,0);
      auVar121._28_4_ = (uint)bVar82 * auVar116._28_4_ | (uint)!bVar82 * auVar120._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar116,local_660);
      auVar122._0_4_ =
           (uint)(bVar74 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar116._0_4_;
      bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar82 * auVar120._4_4_ | (uint)!bVar82 * auVar116._4_4_;
      bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar82 * auVar120._8_4_ | (uint)!bVar82 * auVar116._8_4_;
      bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar82 * auVar120._12_4_ | (uint)!bVar82 * auVar116._12_4_;
      bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar82 * auVar120._16_4_ | (uint)!bVar82 * auVar116._16_4_;
      bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar82 * auVar120._20_4_ | (uint)!bVar82 * auVar116._20_4_;
      bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar82 * auVar120._24_4_ | (uint)!bVar82 * auVar116._24_4_;
      bVar82 = SUB81(uVar80 >> 7,0);
      auVar122._28_4_ = (uint)bVar82 * auVar120._28_4_ | (uint)!bVar82 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar116);
      _local_420 = vmaxps_avx512vl(local_220,auVar116);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      local_440 = vmulps_avx512vl(_local_420,auVar33);
      vandps_avx512vl(auVar110,auVar116);
      uVar83 = vcmpps_avx512vl(local_440,local_440,1);
      uVar80 = uVar80 & uVar83;
      bVar77 = (byte)uVar80;
      if (bVar77 != 0) {
        uVar83 = vcmpps_avx512vl(auVar98,_DAT_01faff00,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar98,auVar93);
        bVar76 = (byte)uVar83;
        uVar84 = (uint)(bVar76 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar98._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        uVar135 = (uint)bVar82 * auVar110._4_4_ | (uint)!bVar82 * auVar98._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        uVar136 = (uint)bVar82 * auVar110._8_4_ | (uint)!bVar82 * auVar98._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        uVar137 = (uint)bVar82 * auVar110._12_4_ | (uint)!bVar82 * auVar98._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        uVar138 = (uint)bVar82 * auVar110._16_4_ | (uint)!bVar82 * auVar98._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        uVar139 = (uint)bVar82 * auVar110._20_4_ | (uint)!bVar82 * auVar98._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        uVar140 = (uint)bVar82 * auVar110._24_4_ | (uint)!bVar82 * auVar98._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        uVar141 = (uint)bVar82 * auVar110._28_4_ | (uint)!bVar82 * auVar98._28_4_;
        auVar121._0_4_ = (bVar77 & 1) * uVar84 | !(bool)(bVar77 & 1) * auVar121._0_4_;
        bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar121._4_4_ = bVar82 * uVar135 | !bVar82 * auVar121._4_4_;
        bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar121._8_4_ = bVar82 * uVar136 | !bVar82 * auVar121._8_4_;
        bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar121._12_4_ = bVar82 * uVar137 | !bVar82 * auVar121._12_4_;
        bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar121._16_4_ = bVar82 * uVar138 | !bVar82 * auVar121._16_4_;
        bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar121._20_4_ = bVar82 * uVar139 | !bVar82 * auVar121._20_4_;
        bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar121._24_4_ = bVar82 * uVar140 | !bVar82 * auVar121._24_4_;
        bVar82 = SUB81(uVar80 >> 7,0);
        auVar121._28_4_ = bVar82 * uVar141 | !bVar82 * auVar121._28_4_;
        auVar98 = vblendmps_avx512vl(auVar93,auVar98);
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar83 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar83 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar83 >> 6) & 1);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar76 & 1) * auVar98._0_4_ | !(bool)(bVar76 & 1) * uVar84) |
             !(bool)(bVar77 & 1) * auVar122._0_4_;
        bVar7 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar7 * ((uint)bVar82 * auVar98._4_4_ | !bVar82 * uVar135) |
             !bVar7 * auVar122._4_4_;
        bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar82 * ((uint)bVar8 * auVar98._8_4_ | !bVar8 * uVar136) |
             !bVar82 * auVar122._8_4_;
        bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar82 * ((uint)bVar9 * auVar98._12_4_ | !bVar9 * uVar137) |
             !bVar82 * auVar122._12_4_;
        bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar82 * ((uint)bVar10 * auVar98._16_4_ | !bVar10 * uVar138) |
             !bVar82 * auVar122._16_4_;
        bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar82 * ((uint)bVar11 * auVar98._20_4_ | !bVar11 * uVar139) |
             !bVar82 * auVar122._20_4_;
        bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar82 * ((uint)bVar12 * auVar98._24_4_ | !bVar12 * uVar140) |
             !bVar82 * auVar122._24_4_;
        bVar82 = SUB81(uVar80 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar82 * ((uint)bVar13 * auVar98._28_4_ | !bVar13 * uVar141) |
             !bVar82 * auVar122._28_4_;
        bVar74 = (~bVar77 | bVar76) & bVar74;
      }
      auVar70._4_4_ = uStack_3bc;
      auVar70._0_4_ = local_3c0;
      auVar70._8_4_ = uStack_3b8;
      auVar70._12_4_ = uStack_3b4;
      auVar70._16_4_ = uStack_3b0;
      auVar70._20_4_ = uStack_3ac;
      auVar70._24_4_ = uStack_3a8;
      auVar70._28_4_ = uStack_3a4;
      if ((bVar74 & 0x7f) == 0) {
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar113._16_4_ = 0x3f800000;
        auVar113._20_4_ = 0x3f800000;
        auVar113._24_4_ = 0x3f800000;
        auVar113._28_4_ = 0x3f800000;
        goto LAB_01d68d1d;
      }
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar93);
      auVar94 = vxorps_avx512vl(auVar94,auVar93);
      auVar108 = vxorps_avx512vl(auVar108,auVar93);
      auVar87 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4b0);
      auVar98 = vbroadcastss_avx512vl(auVar87);
      auVar110 = vmaxps_avx512vl(auVar98,auVar121);
      auVar87 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4b0);
      auVar98 = vbroadcastss_avx512vl(auVar87);
      auVar116 = vminps_avx512vl(auVar98,auVar122);
      auVar98 = vmulps_avx512vl(auVar54,auVar114);
      auVar98 = vfmadd213ps_avx512vl(auVar112,auVar53,auVar98);
      auVar87 = vfmadd213ps_fma(auVar111,auVar52,auVar98);
      auVar98 = vmulps_avx512vl(auVar70,auVar54);
      auVar262 = ZEXT3264(local_640);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_640,auVar53);
      auVar111 = vfmadd231ps_avx512vl(auVar98,local_340,auVar52);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar247,auVar111);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar98,auVar112,1);
      auVar98 = vxorps_avx512vl(ZEXT1632(auVar87),auVar93);
      auVar114 = vrcp14ps_avx512vl(auVar111);
      auVar120 = vxorps_avx512vl(auVar111,auVar93);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar123 = vfnmadd213ps_avx512vl(auVar114,auVar111,auVar113);
      auVar87 = vfmadd132ps_fma(auVar123,auVar114,auVar114);
      fVar205 = auVar87._0_4_ * auVar98._0_4_;
      fVar142 = auVar87._4_4_ * auVar98._4_4_;
      auVar57._4_4_ = fVar142;
      auVar57._0_4_ = fVar205;
      fVar239 = auVar87._8_4_ * auVar98._8_4_;
      auVar57._8_4_ = fVar239;
      fVar240 = auVar87._12_4_ * auVar98._12_4_;
      auVar57._12_4_ = fVar240;
      fVar241 = auVar98._16_4_ * 0.0;
      auVar57._16_4_ = fVar241;
      fVar218 = auVar98._20_4_ * 0.0;
      auVar57._20_4_ = fVar218;
      fVar219 = auVar98._24_4_ * 0.0;
      auVar57._24_4_ = fVar219;
      auVar57._28_4_ = auVar98._28_4_;
      uVar19 = vcmpps_avx512vl(auVar111,auVar120,1);
      bVar77 = (byte)uVar17 | (byte)uVar19;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar57,auVar123);
      auVar125._0_4_ =
           (uint)(bVar77 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar114._0_4_;
      bVar82 = (bool)(bVar77 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar82 * auVar124._4_4_ | (uint)!bVar82 * auVar114._4_4_;
      bVar82 = (bool)(bVar77 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar82 * auVar124._8_4_ | (uint)!bVar82 * auVar114._8_4_;
      bVar82 = (bool)(bVar77 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar82 * auVar124._12_4_ | (uint)!bVar82 * auVar114._12_4_;
      bVar82 = (bool)(bVar77 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar82 * auVar124._16_4_ | (uint)!bVar82 * auVar114._16_4_;
      bVar82 = (bool)(bVar77 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar82 * auVar124._20_4_ | (uint)!bVar82 * auVar114._20_4_;
      bVar82 = (bool)(bVar77 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar82 * auVar124._24_4_ | (uint)!bVar82 * auVar114._24_4_;
      auVar125._28_4_ =
           (uint)(bVar77 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar114._28_4_;
      auVar110 = vmaxps_avx512vl(auVar110,auVar125);
      auVar249 = ZEXT3264(auVar110);
      uVar19 = vcmpps_avx512vl(auVar111,auVar120,6);
      bVar77 = (byte)uVar17 | (byte)uVar19;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126._0_4_ =
           (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar205;
      bVar82 = (bool)(bVar77 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar82 * auVar111._4_4_ | (uint)!bVar82 * (int)fVar142;
      bVar82 = (bool)(bVar77 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar82 * auVar111._8_4_ | (uint)!bVar82 * (int)fVar239;
      bVar82 = (bool)(bVar77 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar82 * auVar111._12_4_ | (uint)!bVar82 * (int)fVar240;
      bVar82 = (bool)(bVar77 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar82 * auVar111._16_4_ | (uint)!bVar82 * (int)fVar241;
      bVar82 = (bool)(bVar77 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar82 * auVar111._20_4_ | (uint)!bVar82 * (int)fVar218;
      bVar82 = (bool)(bVar77 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar82 * auVar111._24_4_ | (uint)!bVar82 * (int)fVar219;
      auVar126._28_4_ =
           (uint)(bVar77 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar98._28_4_;
      auVar114 = vminps_avx512vl(auVar116,auVar126);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,auVar95);
      auVar95 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar116 = ZEXT832(0) << 0x20;
      auVar106 = vsubps_avx(auVar116,auVar107);
      auVar106 = vmulps_avx512vl(auVar106,auVar109);
      auVar95 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar95);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar98);
      auVar95 = vmulps_avx512vl(auVar70,auVar109);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_640,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_340,auVar94);
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar34._16_4_ = 0x7fffffff;
      auVar34._20_4_ = 0x7fffffff;
      auVar34._24_4_ = 0x7fffffff;
      auVar34._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar95,auVar34);
      uVar17 = vcmpps_avx512vl(auVar95,auVar112,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar93);
      auVar106 = vrcp14ps_avx512vl(auVar95);
      auVar107 = vxorps_avx512vl(auVar95,auVar93);
      auVar245 = ZEXT3264(auVar107);
      auVar93 = vfnmadd213ps_avx512vl(auVar106,auVar95,auVar113);
      auVar87 = vfmadd132ps_fma(auVar93,auVar106,auVar106);
      auVar252 = ZEXT1664(auVar87);
      fVar205 = auVar87._0_4_ * auVar98._0_4_;
      fVar142 = auVar87._4_4_ * auVar98._4_4_;
      auVar58._4_4_ = fVar142;
      auVar58._0_4_ = fVar205;
      fVar239 = auVar87._8_4_ * auVar98._8_4_;
      auVar58._8_4_ = fVar239;
      fVar240 = auVar87._12_4_ * auVar98._12_4_;
      auVar58._12_4_ = fVar240;
      fVar241 = auVar98._16_4_ * 0.0;
      auVar58._16_4_ = fVar241;
      fVar218 = auVar98._20_4_ * 0.0;
      auVar58._20_4_ = fVar218;
      fVar219 = auVar98._24_4_ * 0.0;
      auVar58._24_4_ = fVar219;
      auVar58._28_4_ = auVar98._28_4_;
      uVar19 = vcmpps_avx512vl(auVar95,auVar107,1);
      bVar77 = (byte)uVar17 | (byte)uVar19;
      auVar93 = vblendmps_avx512vl(auVar58,auVar123);
      auVar127._0_4_ =
           (uint)(bVar77 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar106._0_4_;
      bVar82 = (bool)(bVar77 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar82 * auVar93._4_4_ | (uint)!bVar82 * auVar106._4_4_;
      bVar82 = (bool)(bVar77 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar82 * auVar93._8_4_ | (uint)!bVar82 * auVar106._8_4_;
      bVar82 = (bool)(bVar77 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar82 * auVar93._12_4_ | (uint)!bVar82 * auVar106._12_4_;
      bVar82 = (bool)(bVar77 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar82 * auVar93._16_4_ | (uint)!bVar82 * auVar106._16_4_;
      bVar82 = (bool)(bVar77 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar82 * auVar93._20_4_ | (uint)!bVar82 * auVar106._20_4_;
      bVar82 = (bool)(bVar77 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar82 * auVar93._24_4_ | (uint)!bVar82 * auVar106._24_4_;
      auVar127._28_4_ =
           (uint)(bVar77 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar106._28_4_;
      _local_5c0 = vmaxps_avx(auVar110,auVar127);
      auVar242 = ZEXT3264(_local_5c0);
      uVar19 = vcmpps_avx512vl(auVar95,auVar107,6);
      bVar77 = (byte)uVar17 | (byte)uVar19;
      auVar128._0_4_ =
           (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar205;
      bVar82 = (bool)(bVar77 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar82 * auVar111._4_4_ | (uint)!bVar82 * (int)fVar142;
      bVar82 = (bool)(bVar77 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar82 * auVar111._8_4_ | (uint)!bVar82 * (int)fVar239;
      bVar82 = (bool)(bVar77 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar82 * auVar111._12_4_ | (uint)!bVar82 * (int)fVar240;
      bVar82 = (bool)(bVar77 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar82 * auVar111._16_4_ | (uint)!bVar82 * (int)fVar241;
      bVar82 = (bool)(bVar77 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar82 * auVar111._20_4_ | (uint)!bVar82 * (int)fVar218;
      bVar82 = (bool)(bVar77 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar82 * auVar111._24_4_ | (uint)!bVar82 * (int)fVar219;
      auVar128._28_4_ =
           (uint)(bVar77 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar98._28_4_;
      local_300 = vminps_avx(auVar114,auVar128);
      auVar238 = ZEXT3264(local_300);
      auVar98 = _local_5c0;
      uVar17 = vcmpps_avx512vl(_local_5c0,local_300,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar17;
      if (bVar74 == 0) goto LAB_01d68d1d;
      auVar95 = vmaxps_avx(auVar116,local_900);
      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar117,auVar99);
      auVar105 = vmulps_avx512vl(auVar96,auVar105);
      auVar106 = vfmadd213ps_avx512vl(local_660,auVar117,auVar99);
      fVar205 = auVar96._0_4_;
      fVar142 = auVar96._4_4_;
      auVar59._4_4_ = fVar142 * auVar106._4_4_;
      auVar59._0_4_ = fVar205 * auVar106._0_4_;
      fVar239 = auVar96._8_4_;
      auVar59._8_4_ = fVar239 * auVar106._8_4_;
      fVar240 = auVar96._12_4_;
      auVar59._12_4_ = fVar240 * auVar106._12_4_;
      fVar241 = auVar96._16_4_;
      auVar59._16_4_ = fVar241 * auVar106._16_4_;
      fVar218 = auVar96._20_4_;
      auVar59._20_4_ = fVar218 * auVar106._20_4_;
      fVar219 = auVar96._24_4_;
      auVar59._24_4_ = fVar219 * auVar106._24_4_;
      auVar59._28_4_ = auVar106._28_4_;
      auVar105 = vminps_avx512vl(auVar105,auVar113);
      auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
      auVar107 = vminps_avx512vl(auVar59,auVar113);
      auVar60._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar105._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar60,local_7a0,local_620);
      auVar105 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
      auVar61._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar105._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar61,local_7a0,local_620);
      auVar62._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar62._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar62._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar62._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar62._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar62._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar62._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar62._28_4_ = auVar95._28_4_;
      auVar105 = vsubps_avx(local_5a0,auVar62);
      auVar63._4_4_ = auVar105._4_4_ * (float)local_500._4_4_;
      auVar63._0_4_ = auVar105._0_4_ * (float)local_500._0_4_;
      auVar63._8_4_ = auVar105._8_4_ * fStack_4f8;
      auVar63._12_4_ = auVar105._12_4_ * fStack_4f4;
      auVar63._16_4_ = auVar105._16_4_ * fStack_4f0;
      auVar63._20_4_ = auVar105._20_4_ * fStack_4ec;
      auVar63._24_4_ = auVar105._24_4_ * fStack_4e8;
      auVar63._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(local_4e0,auVar63);
      uVar80 = vcmpps_avx512vl(auVar95,ZEXT832(0) << 0x20,5);
      auVar258 = ZEXT3264(local_6e0);
      auVar261 = ZEXT3264(local_700);
      auVar264 = ZEXT3264(local_720);
      auVar265 = ZEXT3264(local_740);
      auVar266 = ZEXT3264(local_7c0);
      if ((byte)uVar80 == 0) {
        uVar80 = 0;
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar252 = ZEXT864(0) << 0x20;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar242 = ZEXT864(0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar88 = vxorps_avx512vl(auVar145,auVar145);
        uVar83 = vcmpps_avx512vl(auVar95,auVar116,5);
        auVar95 = vsqrtps_avx(auVar95);
        auVar106 = vfnmadd213ps_avx512vl(auVar119,local_400,auVar113);
        auVar93 = vfmadd132ps_avx512vl(auVar106,local_400,local_400);
        auVar106 = vsubps_avx(local_680,auVar95);
        auVar94 = vmulps_avx512vl(auVar106,auVar93);
        auVar95 = vsubps_avx512vl(auVar95,auVar115);
        auVar93 = vmulps_avx512vl(auVar95,auVar93);
        auVar95 = vfmadd213ps_avx512vl(auVar117,auVar94,auVar99);
        auVar64._4_4_ = fVar142 * auVar95._4_4_;
        auVar64._0_4_ = fVar205 * auVar95._0_4_;
        auVar64._8_4_ = fVar239 * auVar95._8_4_;
        auVar64._12_4_ = fVar240 * auVar95._12_4_;
        auVar64._16_4_ = fVar241 * auVar95._16_4_;
        auVar64._20_4_ = fVar218 * auVar95._20_4_;
        auVar64._24_4_ = fVar219 * auVar95._24_4_;
        auVar64._28_4_ = auVar107._28_4_;
        auVar95 = vmulps_avx512vl(local_340,auVar94);
        auVar106 = vmulps_avx512vl(local_640,auVar94);
        auVar71._4_4_ = uStack_3bc;
        auVar71._0_4_ = local_3c0;
        auVar71._8_4_ = uStack_3b8;
        auVar71._12_4_ = uStack_3b4;
        auVar71._16_4_ = uStack_3b0;
        auVar71._20_4_ = uStack_3ac;
        auVar71._24_4_ = uStack_3a8;
        auVar71._28_4_ = uStack_3a4;
        auVar108 = vmulps_avx512vl(auVar71,auVar94);
        auVar107 = vfmadd213ps_avx512vl(auVar100,auVar64,auVar102);
        auVar95 = vsubps_avx512vl(auVar95,auVar107);
        auVar107 = vfmadd213ps_avx512vl(auVar101,auVar64,auVar103);
        auVar107 = vsubps_avx512vl(auVar106,auVar107);
        auVar87 = vfmadd213ps_fma(auVar64,auVar97,auVar104);
        auVar106 = vsubps_avx(auVar108,ZEXT1632(auVar87));
        auVar242 = ZEXT3264(auVar106);
        auVar99 = vfmadd213ps_avx512vl(auVar117,auVar93,auVar99);
        auVar65._4_4_ = fVar142 * auVar99._4_4_;
        auVar65._0_4_ = fVar205 * auVar99._0_4_;
        auVar65._8_4_ = fVar239 * auVar99._8_4_;
        auVar65._12_4_ = fVar240 * auVar99._12_4_;
        auVar65._16_4_ = fVar241 * auVar99._16_4_;
        auVar65._20_4_ = fVar218 * auVar99._20_4_;
        auVar65._24_4_ = fVar219 * auVar99._24_4_;
        auVar65._28_4_ = auVar96._28_4_;
        auVar96 = vmulps_avx512vl(local_340,auVar93);
        auVar99 = vmulps_avx512vl(local_640,auVar93);
        auVar108 = vmulps_avx512vl(auVar71,auVar93);
        auVar87 = vfmadd213ps_fma(auVar100,auVar65,auVar102);
        auVar106 = vsubps_avx(auVar96,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar101,auVar65,auVar103);
        auVar96 = vsubps_avx(auVar99,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar97,auVar65,auVar104);
        auVar99 = vsubps_avx512vl(auVar108,ZEXT1632(auVar87));
        auVar252 = ZEXT3264(auVar99);
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar99 = vblendmps_avx512vl(auVar153,auVar94);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar129._0_4_ = (uint)bVar82 * auVar99._0_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar82 * auVar99._4_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar82 * auVar99._8_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar82 * auVar99._12_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar82 * auVar99._16_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar82 * auVar99._20_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar82 * auVar99._24_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar129._28_4_ = (uint)bVar82 * auVar99._28_4_ | (uint)!bVar82 * 0x7f800000;
        auVar196._8_4_ = 0xff800000;
        auVar196._0_8_ = 0xff800000ff800000;
        auVar196._12_4_ = 0xff800000;
        auVar196._16_4_ = 0xff800000;
        auVar196._20_4_ = 0xff800000;
        auVar196._24_4_ = 0xff800000;
        auVar196._28_4_ = 0xff800000;
        auVar99 = vblendmps_avx512vl(auVar196,auVar93);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar130._0_4_ = (uint)bVar82 * auVar99._0_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar82 * auVar99._4_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar82 * auVar99._8_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar82 * auVar99._12_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar82 * auVar99._16_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar82 * auVar99._20_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar82 * auVar99._24_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar130._28_4_ = (uint)bVar82 * auVar99._28_4_ | (uint)!bVar82 * -0x800000;
        auVar35._8_4_ = 0x36000000;
        auVar35._0_8_ = 0x3600000036000000;
        auVar35._12_4_ = 0x36000000;
        auVar35._16_4_ = 0x36000000;
        auVar35._20_4_ = 0x36000000;
        auVar35._24_4_ = 0x36000000;
        auVar35._28_4_ = 0x36000000;
        auVar99 = vmulps_avx512vl(_local_420,auVar35);
        uVar18 = vcmpps_avx512vl(auVar99,local_440,0xe);
        uVar83 = uVar83 & uVar18;
        bVar77 = (byte)uVar83;
        if (bVar77 != 0) {
          uVar18 = vcmpps_avx512vl(auVar105,ZEXT1632(auVar88),2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar234,auVar248);
          bVar76 = (byte)uVar18;
          uVar84 = (uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
          bVar82 = (bool)((byte)(uVar18 >> 1) & 1);
          uVar135 = (uint)bVar82 * auVar100._4_4_ | (uint)!bVar82 * auVar99._4_4_;
          bVar82 = (bool)((byte)(uVar18 >> 2) & 1);
          uVar136 = (uint)bVar82 * auVar100._8_4_ | (uint)!bVar82 * auVar99._8_4_;
          bVar82 = (bool)((byte)(uVar18 >> 3) & 1);
          uVar137 = (uint)bVar82 * auVar100._12_4_ | (uint)!bVar82 * auVar99._12_4_;
          bVar82 = (bool)((byte)(uVar18 >> 4) & 1);
          uVar138 = (uint)bVar82 * auVar100._16_4_ | (uint)!bVar82 * auVar99._16_4_;
          bVar82 = (bool)((byte)(uVar18 >> 5) & 1);
          uVar139 = (uint)bVar82 * auVar100._20_4_ | (uint)!bVar82 * auVar99._20_4_;
          bVar82 = (bool)((byte)(uVar18 >> 6) & 1);
          uVar140 = (uint)bVar82 * auVar100._24_4_ | (uint)!bVar82 * auVar99._24_4_;
          bVar82 = SUB81(uVar18 >> 7,0);
          uVar141 = (uint)bVar82 * auVar100._28_4_ | (uint)!bVar82 * auVar99._28_4_;
          auVar129._0_4_ = (bVar77 & 1) * uVar84 | !(bool)(bVar77 & 1) * auVar129._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar129._4_4_ = bVar82 * uVar135 | !bVar82 * auVar129._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar129._8_4_ = bVar82 * uVar136 | !bVar82 * auVar129._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar129._12_4_ = bVar82 * uVar137 | !bVar82 * auVar129._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar129._16_4_ = bVar82 * uVar138 | !bVar82 * auVar129._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar129._20_4_ = bVar82 * uVar139 | !bVar82 * auVar129._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar129._24_4_ = bVar82 * uVar140 | !bVar82 * auVar129._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar129._28_4_ = bVar82 * uVar141 | !bVar82 * auVar129._28_4_;
          auVar99 = vblendmps_avx512vl(auVar248,auVar234);
          bVar82 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar18 >> 6) & 1);
          bVar13 = SUB81(uVar18 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar76 & 1) * auVar99._0_4_ | !(bool)(bVar76 & 1) * uVar84) |
               !(bool)(bVar77 & 1) * auVar130._0_4_;
          bVar7 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar7 * ((uint)bVar82 * auVar99._4_4_ | !bVar82 * uVar135) |
               !bVar7 * auVar130._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar82 * ((uint)bVar8 * auVar99._8_4_ | !bVar8 * uVar136) |
               !bVar82 * auVar130._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar82 * ((uint)bVar9 * auVar99._12_4_ | !bVar9 * uVar137) |
               !bVar82 * auVar130._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar82 * ((uint)bVar10 * auVar99._16_4_ | !bVar10 * uVar138) |
               !bVar82 * auVar130._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar82 * ((uint)bVar11 * auVar99._20_4_ | !bVar11 * uVar139) |
               !bVar82 * auVar130._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar82 * ((uint)bVar12 * auVar99._24_4_ | !bVar12 * uVar140) |
               !bVar82 * auVar130._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar82 * ((uint)bVar13 * auVar99._28_4_ | !bVar13 * uVar141) |
               !bVar82 * auVar130._28_4_;
          uVar80 = (ulong)(byte)((~bVar77 | bVar76) & (byte)uVar80);
        }
      }
      auVar260 = ZEXT3264(local_7e0);
      auVar254 = ZEXT3264(local_800);
      auVar257 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_840);
      auVar263 = ZEXT3264(local_860);
      auVar267 = ZEXT3264(local_880);
      uVar144 = *(undefined4 *)&(ray->dir).field_0;
      auVar230._4_4_ = uVar144;
      auVar230._0_4_ = uVar144;
      auVar230._8_4_ = uVar144;
      auVar230._12_4_ = uVar144;
      auVar230._16_4_ = uVar144;
      auVar230._20_4_ = uVar144;
      auVar230._24_4_ = uVar144;
      auVar230._28_4_ = uVar144;
      uVar144 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar235._4_4_ = uVar144;
      auVar235._0_4_ = uVar144;
      auVar235._8_4_ = uVar144;
      auVar235._12_4_ = uVar144;
      auVar235._16_4_ = uVar144;
      auVar235._20_4_ = uVar144;
      auVar235._24_4_ = uVar144;
      auVar235._28_4_ = uVar144;
      fVar205 = (ray->dir).field_0.m128[2];
      auVar249 = ZEXT3264(CONCAT428(fVar205,CONCAT424(fVar205,CONCAT420(fVar205,CONCAT416(fVar205,
                                                  CONCAT412(fVar205,CONCAT48(fVar205,CONCAT44(
                                                  fVar205,fVar205))))))));
      auVar229._0_4_ = fVar205 * auVar252._0_4_;
      auVar229._4_4_ = fVar205 * auVar252._4_4_;
      auVar229._8_4_ = fVar205 * auVar252._8_4_;
      auVar229._12_4_ = fVar205 * auVar252._12_4_;
      auVar229._16_4_ = fVar205 * auVar252._16_4_;
      auVar229._20_4_ = fVar205 * auVar252._20_4_;
      auVar229._28_36_ = auVar252._28_36_;
      auVar229._24_4_ = fVar205 * auVar252._24_4_;
      auVar87 = vfmadd231ps_fma(auVar229._0_32_,auVar235,auVar96);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar230,auVar106);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar245 = ZEXT3264(auVar244);
      auVar96 = vandps_avx(auVar244,ZEXT1632(auVar87));
      auVar252 = ZEXT3264(_local_5c0);
      _local_2e0 = _local_5c0;
      auVar228._8_4_ = 0x3e99999a;
      auVar228._0_8_ = 0x3e99999a3e99999a;
      auVar228._12_4_ = 0x3e99999a;
      auVar228._16_4_ = 0x3e99999a;
      auVar228._20_4_ = 0x3e99999a;
      auVar228._24_4_ = 0x3e99999a;
      auVar228._28_4_ = 0x3e99999a;
      auVar229 = ZEXT3264(auVar228);
      uVar17 = vcmpps_avx512vl(auVar96,auVar228,1);
      local_90a = (short)uVar17;
      local_3e0 = vmaxps_avx(_local_5c0,auVar130);
      local_320 = local_3e0;
      auVar96 = vminps_avx(local_300,auVar129);
      uVar17 = vcmpps_avx512vl(_local_5c0,auVar96,2);
      bVar77 = (byte)uVar17 & bVar74;
      uVar19 = vcmpps_avx512vl(local_3e0,local_300,2);
      auVar255 = ZEXT3264(local_6a0);
      auVar256 = ZEXT3264(local_6c0);
      if ((bVar74 & ((byte)uVar19 | (byte)uVar17)) == 0) {
        auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar236 = ZEXT3264(_local_8e0);
      }
      else {
        auVar66._4_4_ = auVar242._4_4_ * fVar205;
        auVar66._0_4_ = auVar242._0_4_ * fVar205;
        auVar66._8_4_ = auVar242._8_4_ * fVar205;
        auVar66._12_4_ = auVar242._12_4_ * fVar205;
        auVar66._16_4_ = auVar242._16_4_ * fVar205;
        auVar66._20_4_ = auVar242._20_4_ * fVar205;
        auVar66._24_4_ = auVar242._24_4_ * fVar205;
        auVar66._28_4_ = auVar96._28_4_;
        auVar87 = vfmadd213ps_fma(auVar107,auVar235,auVar66);
        auVar87 = vfmadd213ps_fma(auVar95,auVar230,ZEXT1632(auVar87));
        auVar96 = vandps_avx(auVar244,ZEXT1632(auVar87));
        uVar17 = vcmpps_avx512vl(auVar96,auVar228,1);
        local_888 = (int)CONCAT71((int7)(uVar80 >> 8),~(byte)uVar80);
        bVar76 = (byte)uVar17 | ~(byte)uVar80;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar156,auVar36);
        local_2a0._0_4_ = (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
        bVar82 = (bool)(bVar76 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar76 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar76 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar76 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar76 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar76 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * 2;
        local_2a0._28_4_ = (uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
        local_360 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_360,local_2a0,5);
        local_884 = (uint)bVar77;
        bVar77 = (byte)uVar17 & bVar77;
        _local_500 = auVar118;
        if (bVar77 == 0) {
          fVar205 = ray->tfar;
          auVar158._4_4_ = fVar205;
          auVar158._0_4_ = fVar205;
          auVar158._8_4_ = fVar205;
          auVar158._12_4_ = fVar205;
          auVar158._16_4_ = fVar205;
          auVar158._20_4_ = fVar205;
          auVar158._24_4_ = fVar205;
          auVar158._28_4_ = fVar205;
          auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar236 = ZEXT3264(_local_8e0);
        }
        else {
          auVar88 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar87 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar92 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar91 = vminps_avx(auVar88,auVar92);
          auVar88 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar92 = vmaxps_avx(auVar87,auVar88);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar91,auVar182);
          auVar88 = vandps_avx(auVar92,auVar182);
          auVar87 = vmaxps_avx(auVar87,auVar88);
          auVar88 = vmovshdup_avx(auVar87);
          auVar88 = vmaxss_avx(auVar88,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar88);
          fVar205 = auVar87._0_4_ * 1.9073486e-06;
          local_4a0 = vshufps_avx(auVar92,auVar92,0xff);
          local_3a0 = (float)local_5c0._0_4_ + (float)local_8e0._0_4_;
          fStack_39c = (float)local_5c0._4_4_ + (float)local_8e0._4_4_;
          fStack_398 = fStack_5b8 + fStack_8d8;
          fStack_394 = fStack_5b4 + fStack_8d4;
          fStack_390 = fStack_5b0 + fStack_8d0;
          fStack_38c = fStack_5ac + fStack_8cc;
          fStack_388 = fStack_5a8 + fStack_8c8;
          fStack_384 = fStack_5a4 + fStack_8c4;
          _local_5c0 = auVar98;
          do {
            auVar99 = local_900;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar98 = vblendmps_avx512vl(auVar157,_local_5c0);
            auVar132._0_4_ =
                 (uint)(bVar77 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 6 & 1);
            auVar132._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 0x7f800000;
            auVar132._28_4_ =
                 (uint)(bVar77 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
            auVar98 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar98 = vminps_avx(auVar132,auVar98);
            auVar96 = vshufpd_avx(auVar98,auVar98,5);
            auVar98 = vminps_avx(auVar98,auVar96);
            auVar96 = vpermpd_avx2(auVar98,0x4e);
            auVar98 = vminps_avx(auVar98,auVar96);
            uVar17 = vcmpps_avx512vl(auVar132,auVar98,0);
            bVar75 = (byte)uVar17 & bVar77;
            bVar76 = bVar77;
            if (bVar75 != 0) {
              bVar76 = bVar75;
            }
            iVar21 = 0;
            for (uVar84 = (uint)bVar76; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar1;
            auVar87 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar87._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar77;
              local_900._2_30_ = auVar99._2_30_;
              local_620._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar21 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar21 << 2)));
              fVar142 = sqrtf(auVar87._0_4_);
              bVar77 = local_900[0];
              auVar87 = local_7a0._0_16_;
              auVar88 = local_620._0_16_;
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              fVar142 = auVar87._0_4_;
              auVar87 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar21 << 2)));
              auVar88 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar21 << 2)));
            }
            auVar87 = vinsertps_avx(auVar87,auVar88,0x10);
            auVar242 = ZEXT1664(auVar87);
            bVar82 = true;
            uVar80 = 0;
            do {
              uVar144 = auVar242._0_4_;
              auVar147._4_4_ = uVar144;
              auVar147._0_4_ = uVar144;
              auVar147._8_4_ = uVar144;
              auVar147._12_4_ = uVar144;
              auVar88 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_4e0._0_16_);
              _local_500 = auVar242._0_16_;
              auVar87 = vmovshdup_avx(auVar242._0_16_);
              fVar219 = auVar87._0_4_;
              fVar218 = 1.0 - fVar219;
              fVar241 = fVar218 * fVar218 * fVar218;
              fVar239 = fVar219 * fVar219;
              fVar165 = fVar239 * fVar219;
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                        ZEXT416((uint)fVar165));
              fVar240 = fVar219 * fVar218;
              local_620._0_16_ = ZEXT416((uint)fVar218);
              local_900._0_16_ = auVar87;
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar219 * 6.0)),
                                        ZEXT416((uint)(fVar240 * fVar218)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar241));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar218 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar240 * fVar219)));
              fVar241 = fVar241 * 0.16666667;
              fVar218 = (auVar92._0_4_ + auVar91._0_4_) * 0.16666667;
              fVar219 = (auVar87._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar165 = fVar165 * 0.16666667;
              auVar183._0_4_ = fVar165 * (float)local_580._0_4_;
              auVar183._4_4_ = fVar165 * (float)local_580._4_4_;
              auVar183._8_4_ = fVar165 * fStack_578;
              auVar183._12_4_ = fVar165 * fStack_574;
              auVar220._4_4_ = fVar219;
              auVar220._0_4_ = fVar219;
              auVar220._8_4_ = fVar219;
              auVar220._12_4_ = fVar219;
              auVar87 = vfmadd132ps_fma(auVar220,auVar183,local_540._0_16_);
              auVar184._4_4_ = fVar218;
              auVar184._0_4_ = fVar218;
              auVar184._8_4_ = fVar218;
              auVar184._12_4_ = fVar218;
              auVar87 = vfmadd132ps_fma(auVar184,auVar87,local_560._0_16_);
              auVar167._4_4_ = fVar241;
              auVar167._0_4_ = fVar241;
              auVar167._8_4_ = fVar241;
              auVar167._12_4_ = fVar241;
              auVar87 = vfmadd132ps_fma(auVar167,auVar87,local_520._0_16_);
              local_400._0_16_ = auVar87;
              auVar87 = vsubps_avx(auVar88,auVar87);
              local_7a0._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_5a0._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_660._0_4_ = fVar239;
                local_680._0_4_ = fVar240;
                auVar249._0_4_ = sqrtf(auVar87._0_4_);
                auVar249._4_60_ = extraout_var;
                auVar87 = auVar249._0_16_;
                fVar240 = (float)local_680._0_4_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_660._0_4_ = fVar239;
              }
              local_420._4_4_ = local_620._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar92 = vfnmsub213ss_fma(local_900._0_16_,local_900._0_16_,
                                         ZEXT416((uint)(fVar240 * 4.0)));
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),local_620._0_16_,
                                        local_620._0_16_);
              fVar239 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar240 = auVar92._0_4_ * 0.5;
              fVar241 = auVar88._0_4_ * 0.5;
              local_660._0_4_ = (float)local_660._0_4_ * 0.5;
              auVar206._0_4_ = (float)local_660._0_4_ * (float)local_580._0_4_;
              auVar206._4_4_ = (float)local_660._0_4_ * (float)local_580._4_4_;
              auVar206._8_4_ = (float)local_660._0_4_ * fStack_578;
              auVar206._12_4_ = (float)local_660._0_4_ * fStack_574;
              auVar168._4_4_ = fVar241;
              auVar168._0_4_ = fVar241;
              auVar168._8_4_ = fVar241;
              auVar168._12_4_ = fVar241;
              auVar88 = vfmadd132ps_fma(auVar168,auVar206,local_540._0_16_);
              auVar185._4_4_ = fVar240;
              auVar185._0_4_ = fVar240;
              auVar185._8_4_ = fVar240;
              auVar185._12_4_ = fVar240;
              auVar88 = vfmadd132ps_fma(auVar185,auVar88,local_560._0_16_);
              auVar250._4_4_ = fVar239;
              auVar250._0_4_ = fVar239;
              auVar250._8_4_ = fVar239;
              auVar250._12_4_ = fVar239;
              local_660._0_16_ = vfmadd132ps_fma(auVar250,auVar88,local_520._0_16_);
              local_440._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
              auVar67._12_4_ = 0;
              auVar67._0_12_ = ZEXT812(0);
              fVar239 = local_440._0_4_;
              local_8a0 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar239));
              local_8b0 = local_8a0._0_4_ * 1.5;
              local_460 = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar239));
              auVar88 = vfnmadd213ss_fma(local_460,local_440._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar87._0_4_;
              if (fVar239 < -fVar239) {
                fVar240 = sqrtf(fVar239);
                auVar87 = ZEXT416((uint)local_680._0_4_);
                auVar92 = local_660._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar240 = auVar92._0_4_;
                auVar92 = local_660._0_16_;
              }
              fVar241 = local_8a0._0_4_;
              fVar239 = local_8b0 + fVar239 * -0.5 * fVar241 * fVar241 * fVar241;
              local_8a0._0_4_ = auVar92._0_4_ * fVar239;
              local_8a0._4_4_ = auVar92._4_4_ * fVar239;
              local_8a0._8_4_ = auVar92._8_4_ * fVar239;
              local_8a0._12_4_ = auVar92._12_4_ * fVar239;
              auVar91 = vdpps_avx(local_7a0._0_16_,local_8a0,0x7f);
              fVar218 = auVar87._0_4_;
              auVar148._0_4_ = auVar91._0_4_ * auVar91._0_4_;
              auVar148._4_4_ = auVar91._4_4_ * auVar91._4_4_;
              auVar148._8_4_ = auVar91._8_4_ * auVar91._8_4_;
              auVar148._12_4_ = auVar91._12_4_ * auVar91._12_4_;
              auVar85 = vsubps_avx(local_5a0._0_16_,auVar148);
              fVar241 = auVar85._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar241;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar86 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              local_8b0 = fVar241 * -0.5;
              if (fVar241 < 0.0) {
                local_490._4_4_ = fVar239;
                local_490._0_4_ = fVar239;
                fStack_488 = fVar239;
                fStack_484 = fVar239;
                local_480 = auVar89;
                local_470 = auVar91;
                fVar241 = sqrtf(fVar241);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar87 = ZEXT416((uint)local_680._0_4_);
                auVar89 = local_480;
                auVar92 = local_660._0_16_;
                auVar91 = local_470;
                fVar239 = (float)local_490._0_4_;
                fVar219 = (float)local_490._4_4_;
                fVar165 = fStack_488;
                fVar204 = fStack_484;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar241 = auVar85._0_4_;
                fVar219 = fVar239;
                fVar165 = fVar239;
                fVar204 = fVar239;
              }
              auVar252 = ZEXT1664(auVar92);
              auVar249 = ZEXT1664(local_5a0._0_16_);
              auVar245 = ZEXT1664(local_7a0._0_16_);
              auVar262 = ZEXT3264(local_640);
              auVar260 = ZEXT3264(local_7e0);
              auVar254 = ZEXT3264(local_800);
              auVar255 = ZEXT3264(local_6a0);
              auVar256 = ZEXT3264(local_6c0);
              auVar257 = ZEXT3264(local_820);
              auVar258 = ZEXT3264(local_6e0);
              auVar259 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_700);
              auVar263 = ZEXT3264(local_860);
              auVar264 = ZEXT3264(local_720);
              auVar265 = ZEXT3264(local_740);
              auVar266 = ZEXT3264(local_7c0);
              auVar267 = ZEXT3264(local_880);
              auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_620._0_16_,
                                         local_900._0_16_);
              auVar3 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                       local_620._0_16_);
              auVar85 = vshufps_avx(_local_500,_local_500,0x55);
              auVar186._0_4_ = auVar85._0_4_ * (float)local_580._0_4_;
              auVar186._4_4_ = auVar85._4_4_ * (float)local_580._4_4_;
              auVar186._8_4_ = auVar85._8_4_ * fStack_578;
              auVar186._12_4_ = auVar85._12_4_ * fStack_574;
              auVar207._0_4_ = auVar3._0_4_;
              auVar207._4_4_ = auVar207._0_4_;
              auVar207._8_4_ = auVar207._0_4_;
              auVar207._12_4_ = auVar207._0_4_;
              auVar85 = vfmadd132ps_fma(auVar207,auVar186,local_540._0_16_);
              auVar170._0_4_ = auVar243._0_4_;
              auVar170._4_4_ = auVar170._0_4_;
              auVar170._8_4_ = auVar170._0_4_;
              auVar170._12_4_ = auVar170._0_4_;
              auVar85 = vfmadd132ps_fma(auVar170,auVar85,local_560._0_16_);
              auVar85 = vfmadd132ps_fma(_local_420,auVar85,local_520._0_16_);
              auVar171._0_4_ = auVar85._0_4_ * (float)local_440._0_4_;
              auVar171._4_4_ = auVar85._4_4_ * (float)local_440._0_4_;
              auVar171._8_4_ = auVar85._8_4_ * (float)local_440._0_4_;
              auVar171._12_4_ = auVar85._12_4_ * (float)local_440._0_4_;
              auVar85 = vdpps_avx(auVar92,auVar85,0x7f);
              fVar181 = auVar85._0_4_;
              auVar187._0_4_ = auVar92._0_4_ * fVar181;
              auVar187._4_4_ = auVar92._4_4_ * fVar181;
              auVar187._8_4_ = auVar92._8_4_ * fVar181;
              auVar187._12_4_ = auVar92._12_4_ * fVar181;
              auVar85 = vsubps_avx(auVar171,auVar187);
              fVar181 = auVar88._0_4_ * (float)local_460._0_4_;
              auVar243 = vmaxss_avx(ZEXT416((uint)fVar205),
                                    ZEXT416((uint)(local_500._0_4_ * fVar142 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar92,auVar22);
              auVar188._0_4_ = fVar239 * auVar85._0_4_ * fVar181;
              auVar188._4_4_ = fVar219 * auVar85._4_4_ * fVar181;
              auVar188._8_4_ = fVar165 * auVar85._8_4_ * fVar181;
              auVar188._12_4_ = fVar204 * auVar85._12_4_ * fVar181;
              auVar88 = vdpps_avx(auVar90,local_8a0,0x7f);
              auVar85 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar205),auVar243);
              auVar87 = vdpps_avx(local_7a0._0_16_,auVar188,0x7f);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar218 + 1.0)),
                                       ZEXT416((uint)(fVar205 / fVar240)),auVar85);
              fVar239 = auVar88._0_4_ + auVar87._0_4_;
              auVar87 = vdpps_avx(local_4e0._0_16_,local_8a0,0x7f);
              auVar88 = vdpps_avx(local_7a0._0_16_,auVar90,0x7f);
              fVar240 = auVar89._0_4_;
              auVar90 = vaddss_avx512f(auVar86,ZEXT416((uint)(fVar240 * local_8b0 *
                                                             fVar240 * fVar240)));
              auVar85 = vdpps_avx(local_7a0._0_16_,local_4e0._0_16_,0x7f);
              auVar86 = vfnmadd231ss_fma(auVar88,auVar91,ZEXT416((uint)fVar239));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar91,auVar87);
              auVar88 = vpermilps_avx(local_400._0_16_,0xff);
              fVar241 = fVar241 - auVar88._0_4_;
              auVar89 = vshufps_avx(auVar92,auVar92,0xff);
              auVar88 = vfmsub213ss_fma(auVar86,auVar90,auVar89);
              auVar232._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar90._0_4_));
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar239),auVar85);
              auVar88 = vinsertps_avx(auVar232,auVar85,0x1c);
              auVar226._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar239),auVar226,0x10);
              auVar208._0_4_ = auVar86._0_4_;
              auVar208._4_4_ = auVar208._0_4_;
              auVar208._8_4_ = auVar208._0_4_;
              auVar208._12_4_ = auVar208._0_4_;
              auVar87 = vdivps_avx(auVar88,auVar208);
              auVar88 = vdivps_avx(auVar85,auVar208);
              fVar239 = auVar91._0_4_;
              auVar229 = ZEXT1664(CONCAT412(fVar241,CONCAT48(fVar241,CONCAT44(fVar241,fVar241))));
              auVar209._0_4_ = fVar239 * auVar87._0_4_ + fVar241 * auVar88._0_4_;
              auVar209._4_4_ = fVar239 * auVar87._4_4_ + fVar241 * auVar88._4_4_;
              auVar209._8_4_ = fVar239 * auVar87._8_4_ + fVar241 * auVar88._8_4_;
              auVar209._12_4_ = fVar239 * auVar87._12_4_ + fVar241 * auVar88._12_4_;
              auVar87 = vsubps_avx(_local_500,auVar209);
              auVar242 = ZEXT1664(auVar87);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar91,auVar23);
              if (auVar88._0_4_ < auVar3._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar243._0_4_)),local_4a0,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar91 = vandps_avx512vl(ZEXT416((uint)fVar241),auVar24);
                if (auVar91._0_4_ < auVar88._0_4_) {
                  fVar142 = auVar87._0_4_ + (float)local_4b0._0_4_;
                  bVar75 = 0;
                  bVar76 = 0;
                  if (fVar142 < (ray->org).field_0.m128[3]) goto LAB_01d6974f;
                  auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar236 = ZEXT3264(_local_8e0);
                  if (fVar142 <= ray->tfar) {
                    auVar88 = vmovshdup_avx(auVar87);
                    bVar75 = 0;
                    fVar239 = auVar88._0_4_;
                    if ((0.0 <= fVar239) && (fVar239 <= 1.0)) {
                      auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_)
                                                  );
                      fVar241 = auVar88._0_4_;
                      fVar240 = local_5a0._0_4_ * -0.5;
                      auVar229 = ZEXT464((uint)fVar240);
                      pGVar5 = (context->scene->geometries).items[local_908].ptr;
                      if ((pGVar5->mask & ray->mask) == 0) {
                        bVar75 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar75 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_900._0_4_ = ray->tfar;
                        fVar240 = fVar241 * 1.5 + fVar240 * fVar241 * fVar241 * fVar241;
                        auVar210._0_4_ = local_7a0._0_4_ * fVar240;
                        auVar210._4_4_ = local_7a0._4_4_ * fVar240;
                        auVar210._8_4_ = local_7a0._8_4_ * fVar240;
                        auVar210._12_4_ = local_7a0._12_4_ * fVar240;
                        auVar89 = vfmadd213ps_fma(auVar89,auVar210,auVar92);
                        auVar88 = vshufps_avx(auVar210,auVar210,0xc9);
                        auVar91 = vshufps_avx(auVar92,auVar92,0xc9);
                        auVar211._0_4_ = auVar210._0_4_ * auVar91._0_4_;
                        auVar211._4_4_ = auVar210._4_4_ * auVar91._4_4_;
                        auVar211._8_4_ = auVar210._8_4_ * auVar91._8_4_;
                        auVar211._12_4_ = auVar210._12_4_ * auVar91._12_4_;
                        auVar85 = vfmsub231ps_fma(auVar211,auVar92,auVar88);
                        auVar88 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar91 = vshufps_avx(auVar89,auVar89,0xc9);
                        auVar229 = ZEXT1664(auVar91);
                        auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                        auVar149._0_4_ = auVar89._0_4_ * auVar85._0_4_;
                        auVar149._4_4_ = auVar89._4_4_ * auVar85._4_4_;
                        auVar149._8_4_ = auVar89._8_4_ * auVar85._8_4_;
                        auVar149._12_4_ = auVar89._12_4_ * auVar85._12_4_;
                        auVar85 = vfmsub231ps_fma(auVar149,auVar88,auVar91);
                        auVar88 = vshufps_avx(auVar85,auVar85,0xe9);
                        local_600 = vmovlps_avx(auVar88);
                        local_5f8 = auVar85._0_4_;
                        local_5f4 = fVar239;
                        local_5f0 = 0;
                        local_5ec = (int)local_5c8;
                        local_5e8 = (int)local_908;
                        local_5e4 = context->user->instID[0];
                        local_5e0 = context->user->instPrimID[0];
                        ray->tfar = fVar142;
                        local_910 = -1;
                        local_770.valid = &local_910;
                        local_770.geometryUserPtr = pGVar5->userPtr;
                        local_770.context = context->user;
                        local_770.ray = (RTCRayN *)ray;
                        local_770.hit = (RTCHitN *)&local_600;
                        local_770.N = 1;
                        if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d69967:
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar229 = ZEXT1664(auVar229._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            (*p_Var6)(&local_770);
                            if (*local_770.valid == 0) goto LAB_01d699b4;
                          }
                          bVar75 = 1;
                        }
                        else {
                          auVar229 = ZEXT1664(auVar91);
                          auVar242 = ZEXT1664(auVar87);
                          auVar245 = ZEXT1664(local_7a0._0_16_);
                          auVar249 = ZEXT1664(local_5a0._0_16_);
                          auVar252 = ZEXT1664(auVar92);
                          (*pGVar5->occlusionFilterN)(&local_770);
                          if (*local_770.valid != 0) goto LAB_01d69967;
LAB_01d699b4:
                          ray->tfar = (float)local_900._0_4_;
                          bVar75 = 0;
                        }
                        auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar236 = ZEXT3264(_local_8e0);
                        auVar262 = ZEXT3264(local_640);
                        auVar260 = ZEXT3264(local_7e0);
                        auVar254 = ZEXT3264(local_800);
                        auVar255 = ZEXT3264(local_6a0);
                        auVar256 = ZEXT3264(local_6c0);
                        auVar257 = ZEXT3264(local_820);
                        auVar258 = ZEXT3264(local_6e0);
                        auVar259 = ZEXT3264(local_840);
                        auVar261 = ZEXT3264(local_700);
                        auVar263 = ZEXT3264(local_860);
                        auVar264 = ZEXT3264(local_720);
                        auVar265 = ZEXT3264(local_740);
                        auVar266 = ZEXT3264(local_7c0);
                        auVar267 = ZEXT3264(local_880);
                      }
                    }
                  }
                  goto LAB_01d69761;
                }
              }
              bVar82 = uVar80 < 4;
              uVar80 = uVar80 + 1;
            } while (uVar80 != 5);
            bVar82 = false;
            bVar76 = 5;
LAB_01d6974f:
            bVar75 = bVar76;
            auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar236 = ZEXT3264(_local_8e0);
LAB_01d69761:
            bVar81 = (bool)(bVar81 | bVar82 & bVar75);
            fVar142 = ray->tfar;
            auVar158._4_4_ = fVar142;
            auVar158._0_4_ = fVar142;
            auVar158._8_4_ = fVar142;
            auVar158._12_4_ = fVar142;
            auVar158._16_4_ = fVar142;
            auVar158._20_4_ = fVar142;
            auVar158._24_4_ = fVar142;
            auVar158._28_4_ = fVar142;
            auVar72._4_4_ = fStack_39c;
            auVar72._0_4_ = local_3a0;
            auVar72._8_4_ = fStack_398;
            auVar72._12_4_ = fStack_394;
            auVar72._16_4_ = fStack_390;
            auVar72._20_4_ = fStack_38c;
            auVar72._24_4_ = fStack_388;
            auVar72._28_4_ = fStack_384;
            uVar17 = vcmpps_avx512vl(auVar158,auVar72,0xd);
            bVar77 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar77 & (byte)uVar17;
          } while (bVar77 != 0);
        }
        auVar238 = ZEXT3264(local_320);
        bVar77 = (byte)local_90a | (byte)local_888;
        auVar178._0_4_ = auVar236._0_4_ + local_3e0._0_4_;
        auVar178._4_4_ = auVar236._4_4_ + local_3e0._4_4_;
        auVar178._8_4_ = auVar236._8_4_ + local_3e0._8_4_;
        auVar178._12_4_ = auVar236._12_4_ + local_3e0._12_4_;
        auVar178._16_4_ = auVar236._16_4_ + local_3e0._16_4_;
        auVar178._20_4_ = auVar236._20_4_ + local_3e0._20_4_;
        auVar178._24_4_ = auVar236._24_4_ + local_3e0._24_4_;
        auVar178._28_4_ = auVar236._28_4_ + local_3e0._28_4_;
        uVar17 = vcmpps_avx512vl(auVar178,auVar158,2);
        bVar74 = (byte)uVar19 & bVar74 & (byte)uVar17;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar179,auVar37);
        local_3e0._0_4_ = (uint)(bVar77 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar82 = (bool)(bVar77 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar77 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar77 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar77 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar77 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar77 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 2;
        local_3e0._28_4_ = (uint)(bVar77 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_360,local_3e0,5);
        bVar77 = (byte)uVar17 & bVar74;
        if (bVar77 != 0) {
          auVar88 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar87 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar92 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar91 = vminps_avx(auVar88,auVar92);
          auVar88 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar92 = vmaxps_avx(auVar87,auVar88);
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar91,auVar189);
          auVar88 = vandps_avx(auVar92,auVar189);
          auVar87 = vmaxps_avx(auVar87,auVar88);
          auVar88 = vmovshdup_avx(auVar87);
          auVar88 = vmaxss_avx(auVar88,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar88);
          fVar205 = auVar87._0_4_ * 1.9073486e-06;
          local_4a0 = vshufps_avx(auVar92,auVar92,0xff);
          local_3a0 = local_320._0_4_ + auVar236._0_4_;
          fStack_39c = local_320._4_4_ + auVar236._4_4_;
          fStack_398 = local_320._8_4_ + auVar236._8_4_;
          fStack_394 = local_320._12_4_ + auVar236._12_4_;
          fStack_390 = local_320._16_4_ + auVar236._16_4_;
          fStack_38c = local_320._20_4_ + auVar236._20_4_;
          fStack_388 = local_320._24_4_ + auVar236._24_4_;
          fStack_384 = local_320._28_4_ + auVar236._28_4_;
          _local_5c0 = local_320;
          do {
            auVar99 = local_900;
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar98 = vblendmps_avx512vl(auVar159,auVar238._0_32_);
            auVar133._0_4_ =
                 (uint)(bVar77 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar77 >> 6 & 1);
            auVar133._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 0x7f800000;
            auVar133._28_4_ =
                 (uint)(bVar77 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
            auVar98 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar98 = vminps_avx(auVar133,auVar98);
            auVar96 = vshufpd_avx(auVar98,auVar98,5);
            auVar98 = vminps_avx(auVar98,auVar96);
            auVar96 = vpermpd_avx2(auVar98,0x4e);
            auVar98 = vminps_avx(auVar98,auVar96);
            uVar17 = vcmpps_avx512vl(auVar133,auVar98,0);
            bVar75 = (byte)uVar17 & bVar77;
            bVar76 = bVar77;
            if (bVar75 != 0) {
              bVar76 = bVar75;
            }
            iVar21 = 0;
            for (uVar84 = (uint)bVar76; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar1;
            auVar87 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar87._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar77;
              local_900._2_30_ = auVar99._2_30_;
              local_620._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_300 + (uint)(iVar21 << 2)));
              fVar142 = sqrtf(auVar87._0_4_);
              bVar77 = local_900[0];
              auVar87 = local_7a0._0_16_;
              auVar88 = local_620._0_16_;
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              fVar142 = auVar87._0_4_;
              auVar87 = ZEXT416(*(uint *)(local_300 + (uint)(iVar21 << 2)));
              auVar88 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
            }
            auVar87 = vinsertps_avx(auVar87,auVar88,0x10);
            auVar242 = ZEXT1664(auVar87);
            bVar82 = true;
            uVar80 = 0;
            do {
              uVar144 = auVar242._0_4_;
              auVar150._4_4_ = uVar144;
              auVar150._0_4_ = uVar144;
              auVar150._8_4_ = uVar144;
              auVar150._12_4_ = uVar144;
              auVar88 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_4e0._0_16_);
              _local_500 = auVar242._0_16_;
              auVar87 = vmovshdup_avx(auVar242._0_16_);
              fVar219 = auVar87._0_4_;
              fVar218 = 1.0 - fVar219;
              fVar241 = fVar218 * fVar218 * fVar218;
              fVar239 = fVar219 * fVar219;
              fVar165 = fVar239 * fVar219;
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                        ZEXT416((uint)fVar165));
              fVar240 = fVar219 * fVar218;
              local_620._0_16_ = ZEXT416((uint)fVar218);
              local_900._0_16_ = auVar87;
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar219 * 6.0)),
                                        ZEXT416((uint)(fVar240 * fVar218)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar241));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar218 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar240 * fVar219)));
              fVar241 = fVar241 * 0.16666667;
              fVar218 = (auVar92._0_4_ + auVar91._0_4_) * 0.16666667;
              fVar219 = (auVar87._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar165 = fVar165 * 0.16666667;
              auVar190._0_4_ = fVar165 * (float)local_580._0_4_;
              auVar190._4_4_ = fVar165 * (float)local_580._4_4_;
              auVar190._8_4_ = fVar165 * fStack_578;
              auVar190._12_4_ = fVar165 * fStack_574;
              auVar221._4_4_ = fVar219;
              auVar221._0_4_ = fVar219;
              auVar221._8_4_ = fVar219;
              auVar221._12_4_ = fVar219;
              auVar87 = vfmadd132ps_fma(auVar221,auVar190,local_540._0_16_);
              auVar191._4_4_ = fVar218;
              auVar191._0_4_ = fVar218;
              auVar191._8_4_ = fVar218;
              auVar191._12_4_ = fVar218;
              auVar87 = vfmadd132ps_fma(auVar191,auVar87,local_560._0_16_);
              auVar172._4_4_ = fVar241;
              auVar172._0_4_ = fVar241;
              auVar172._8_4_ = fVar241;
              auVar172._12_4_ = fVar241;
              auVar87 = vfmadd132ps_fma(auVar172,auVar87,local_520._0_16_);
              local_400._0_16_ = auVar87;
              auVar87 = vsubps_avx(auVar88,auVar87);
              local_7a0._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_5a0._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_660._0_4_ = fVar239;
                local_680._0_4_ = fVar240;
                auVar252._0_4_ = sqrtf(auVar87._0_4_);
                auVar252._4_60_ = extraout_var_00;
                auVar87 = auVar252._0_16_;
                fVar240 = (float)local_680._0_4_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_660._0_4_ = fVar239;
              }
              local_420._4_4_ = local_620._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar92 = vfnmsub213ss_fma(local_900._0_16_,local_900._0_16_,
                                         ZEXT416((uint)(fVar240 * 4.0)));
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),local_620._0_16_,
                                        local_620._0_16_);
              fVar239 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar240 = auVar92._0_4_ * 0.5;
              fVar241 = auVar88._0_4_ * 0.5;
              local_660._0_4_ = (float)local_660._0_4_ * 0.5;
              auVar212._0_4_ = (float)local_660._0_4_ * (float)local_580._0_4_;
              auVar212._4_4_ = (float)local_660._0_4_ * (float)local_580._4_4_;
              auVar212._8_4_ = (float)local_660._0_4_ * fStack_578;
              auVar212._12_4_ = (float)local_660._0_4_ * fStack_574;
              auVar173._4_4_ = fVar241;
              auVar173._0_4_ = fVar241;
              auVar173._8_4_ = fVar241;
              auVar173._12_4_ = fVar241;
              auVar88 = vfmadd132ps_fma(auVar173,auVar212,local_540._0_16_);
              auVar192._4_4_ = fVar240;
              auVar192._0_4_ = fVar240;
              auVar192._8_4_ = fVar240;
              auVar192._12_4_ = fVar240;
              auVar88 = vfmadd132ps_fma(auVar192,auVar88,local_560._0_16_);
              auVar251._4_4_ = fVar239;
              auVar251._0_4_ = fVar239;
              auVar251._8_4_ = fVar239;
              auVar251._12_4_ = fVar239;
              local_660._0_16_ = vfmadd132ps_fma(auVar251,auVar88,local_520._0_16_);
              local_440._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
              auVar68._12_4_ = 0;
              auVar68._0_12_ = ZEXT812(0);
              fVar239 = local_440._0_4_;
              auVar92 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar239));
              local_8b0 = auVar92._0_4_ * 1.5;
              local_460 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar239));
              auVar88 = vfnmadd213ss_fma(local_460,local_440._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar87._0_4_;
              if (fVar239 < -fVar239) {
                local_8a0 = auVar92;
                fVar240 = sqrtf(fVar239);
                auVar87 = ZEXT416((uint)local_680._0_4_);
                auVar92 = local_8a0;
                auVar91 = local_660._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar240 = auVar91._0_4_;
                auVar91 = local_660._0_16_;
              }
              fVar241 = auVar92._0_4_;
              local_8b0 = local_8b0 + fVar239 * -0.5 * fVar241 * fVar241 * fVar241;
              fStack_8ac = local_8b0;
              fStack_8a8 = local_8b0;
              fStack_8a4 = local_8b0;
              auVar253._0_4_ = auVar91._0_4_ * local_8b0;
              auVar253._4_4_ = auVar91._4_4_ * local_8b0;
              auVar253._8_4_ = auVar91._8_4_ * local_8b0;
              auVar253._12_4_ = auVar91._12_4_ * local_8b0;
              auVar92 = vdpps_avx(local_7a0._0_16_,auVar253,0x7f);
              fVar241 = auVar87._0_4_;
              auVar151._0_4_ = auVar92._0_4_ * auVar92._0_4_;
              auVar151._4_4_ = auVar92._4_4_ * auVar92._4_4_;
              auVar151._8_4_ = auVar92._8_4_ * auVar92._8_4_;
              auVar151._12_4_ = auVar92._12_4_ * auVar92._12_4_;
              auVar85 = vsubps_avx(local_5a0._0_16_,auVar151);
              fVar239 = auVar85._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar239;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar86 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              local_8a0._0_4_ = fVar239 * -0.5;
              if (fVar239 < 0.0) {
                _local_490 = auVar253;
                local_480 = auVar89;
                local_470 = auVar92;
                fVar239 = sqrtf(fVar239);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar87 = ZEXT416((uint)local_680._0_4_);
                auVar89 = local_480;
                auVar91 = local_660._0_16_;
                auVar92 = local_470;
                auVar253 = _local_490;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar239 = auVar85._0_4_;
              }
              auVar252 = ZEXT1664(auVar91);
              auVar249 = ZEXT1664(local_5a0._0_16_);
              auVar245 = ZEXT1664(local_7a0._0_16_);
              auVar262 = ZEXT3264(local_640);
              auVar260 = ZEXT3264(local_7e0);
              auVar254 = ZEXT3264(local_800);
              auVar255 = ZEXT3264(local_6a0);
              auVar256 = ZEXT3264(local_6c0);
              auVar257 = ZEXT3264(local_820);
              auVar258 = ZEXT3264(local_6e0);
              auVar259 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_700);
              auVar263 = ZEXT3264(local_860);
              auVar264 = ZEXT3264(local_720);
              auVar265 = ZEXT3264(local_740);
              auVar266 = ZEXT3264(local_7c0);
              auVar267 = ZEXT3264(local_880);
              auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_620._0_16_,
                                         local_900._0_16_);
              auVar3 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                       local_620._0_16_);
              auVar85 = vshufps_avx(_local_500,_local_500,0x55);
              auVar193._0_4_ = auVar85._0_4_ * (float)local_580._0_4_;
              auVar193._4_4_ = auVar85._4_4_ * (float)local_580._4_4_;
              auVar193._8_4_ = auVar85._8_4_ * fStack_578;
              auVar193._12_4_ = auVar85._12_4_ * fStack_574;
              auVar213._0_4_ = auVar3._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar85 = vfmadd132ps_fma(auVar213,auVar193,local_540._0_16_);
              auVar175._0_4_ = auVar243._0_4_;
              auVar175._4_4_ = auVar175._0_4_;
              auVar175._8_4_ = auVar175._0_4_;
              auVar175._12_4_ = auVar175._0_4_;
              auVar85 = vfmadd132ps_fma(auVar175,auVar85,local_560._0_16_);
              auVar85 = vfmadd132ps_fma(_local_420,auVar85,local_520._0_16_);
              auVar176._0_4_ = auVar85._0_4_ * (float)local_440._0_4_;
              auVar176._4_4_ = auVar85._4_4_ * (float)local_440._0_4_;
              auVar176._8_4_ = auVar85._8_4_ * (float)local_440._0_4_;
              auVar176._12_4_ = auVar85._12_4_ * (float)local_440._0_4_;
              auVar85 = vdpps_avx(auVar91,auVar85,0x7f);
              fVar218 = auVar85._0_4_;
              auVar194._0_4_ = auVar91._0_4_ * fVar218;
              auVar194._4_4_ = auVar91._4_4_ * fVar218;
              auVar194._8_4_ = auVar91._8_4_ * fVar218;
              auVar194._12_4_ = auVar91._12_4_ * fVar218;
              auVar85 = vsubps_avx(auVar176,auVar194);
              fVar218 = auVar88._0_4_ * (float)local_460._0_4_;
              auVar243 = vmaxss_avx(ZEXT416((uint)fVar205),
                                    ZEXT416((uint)(local_500._0_4_ * fVar142 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar91,auVar25);
              auVar195._0_4_ = auVar85._0_4_ * fVar218 * local_8b0;
              auVar195._4_4_ = auVar85._4_4_ * fVar218 * fStack_8ac;
              auVar195._8_4_ = auVar85._8_4_ * fVar218 * fStack_8a8;
              auVar195._12_4_ = auVar85._12_4_ * fVar218 * fStack_8a4;
              auVar88 = vdpps_avx(auVar90,auVar253,0x7f);
              auVar85 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar205),auVar243);
              auVar87 = vdpps_avx(local_7a0._0_16_,auVar195,0x7f);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),
                                       ZEXT416((uint)(fVar205 / fVar240)),auVar85);
              fVar240 = auVar88._0_4_ + auVar87._0_4_;
              auVar87 = vdpps_avx(local_4e0._0_16_,auVar253,0x7f);
              auVar88 = vdpps_avx(local_7a0._0_16_,auVar90,0x7f);
              fVar241 = auVar89._0_4_;
              auVar90 = vaddss_avx512f(auVar86,ZEXT416((uint)(fVar241 * (float)local_8a0._0_4_ *
                                                             fVar241 * fVar241)));
              auVar85 = vdpps_avx(local_7a0._0_16_,local_4e0._0_16_,0x7f);
              auVar86 = vfnmadd231ss_fma(auVar88,auVar92,ZEXT416((uint)fVar240));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar92,auVar87);
              auVar88 = vpermilps_avx(local_400._0_16_,0xff);
              fVar239 = fVar239 - auVar88._0_4_;
              auVar89 = vshufps_avx(auVar91,auVar91,0xff);
              auVar88 = vfmsub213ss_fma(auVar86,auVar90,auVar89);
              auVar233._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar90._0_4_));
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar240),auVar85);
              auVar88 = vinsertps_avx(auVar233,auVar85,0x1c);
              auVar227._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar240),auVar227,0x10);
              auVar214._0_4_ = auVar86._0_4_;
              auVar214._4_4_ = auVar214._0_4_;
              auVar214._8_4_ = auVar214._0_4_;
              auVar214._12_4_ = auVar214._0_4_;
              auVar87 = vdivps_avx(auVar88,auVar214);
              auVar88 = vdivps_avx(auVar85,auVar214);
              fVar240 = auVar92._0_4_;
              auVar229 = ZEXT1664(CONCAT412(fVar239,CONCAT48(fVar239,CONCAT44(fVar239,fVar239))));
              auVar215._0_4_ = fVar240 * auVar87._0_4_ + fVar239 * auVar88._0_4_;
              auVar215._4_4_ = fVar240 * auVar87._4_4_ + fVar239 * auVar88._4_4_;
              auVar215._8_4_ = fVar240 * auVar87._8_4_ + fVar239 * auVar88._8_4_;
              auVar215._12_4_ = fVar240 * auVar87._12_4_ + fVar239 * auVar88._12_4_;
              auVar87 = vsubps_avx(_local_500,auVar215);
              auVar242 = ZEXT1664(auVar87);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar92,auVar26);
              if (auVar88._0_4_ < auVar3._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar243._0_4_)),local_4a0,
                                          ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(ZEXT416((uint)fVar239),auVar27);
                if (auVar92._0_4_ < auVar88._0_4_) {
                  fVar142 = auVar87._0_4_ + (float)local_4b0._0_4_;
                  bVar75 = 0;
                  bVar76 = 0;
                  if (fVar142 < (ray->org).field_0.m128[3]) goto LAB_01d6a29c;
                  auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar236 = ZEXT3264(_local_8e0);
                  auVar238 = ZEXT3264(_local_5c0);
                  if (ray->tfar < fVar142) goto LAB_01d6a2a5;
                  auVar88 = vmovshdup_avx(auVar87);
                  bVar75 = 0;
                  fVar239 = auVar88._0_4_;
                  if ((fVar239 < 0.0) || (1.0 < fVar239)) goto LAB_01d6a2a5;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_));
                  fVar241 = auVar88._0_4_;
                  fVar240 = local_5a0._0_4_ * -0.5;
                  auVar229 = ZEXT464((uint)fVar240);
                  pGVar5 = (context->scene->geometries).items[local_908].ptr;
                  if ((pGVar5->mask & ray->mask) == 0) {
                    bVar75 = 0;
                    goto LAB_01d6a2a5;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar75 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01d6a2a5;
                  local_900._0_4_ = ray->tfar;
                  fVar240 = fVar241 * 1.5 + fVar240 * fVar241 * fVar241 * fVar241;
                  auVar216._0_4_ = local_7a0._0_4_ * fVar240;
                  auVar216._4_4_ = local_7a0._4_4_ * fVar240;
                  auVar216._8_4_ = local_7a0._8_4_ * fVar240;
                  auVar216._12_4_ = local_7a0._12_4_ * fVar240;
                  auVar89 = vfmadd213ps_fma(auVar89,auVar216,auVar91);
                  auVar88 = vshufps_avx(auVar216,auVar216,0xc9);
                  auVar92 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar217._0_4_ = auVar216._0_4_ * auVar92._0_4_;
                  auVar217._4_4_ = auVar216._4_4_ * auVar92._4_4_;
                  auVar217._8_4_ = auVar216._8_4_ * auVar92._8_4_;
                  auVar217._12_4_ = auVar216._12_4_ * auVar92._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar217,auVar91,auVar88);
                  auVar88 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar92 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar229 = ZEXT1664(auVar92);
                  auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                  auVar152._0_4_ = auVar89._0_4_ * auVar85._0_4_;
                  auVar152._4_4_ = auVar89._4_4_ * auVar85._4_4_;
                  auVar152._8_4_ = auVar89._8_4_ * auVar85._8_4_;
                  auVar152._12_4_ = auVar89._12_4_ * auVar85._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar152,auVar88,auVar92);
                  auVar88 = vshufps_avx(auVar85,auVar85,0xe9);
                  local_600 = vmovlps_avx(auVar88);
                  local_5f8 = auVar85._0_4_;
                  local_5f4 = fVar239;
                  local_5f0 = 0;
                  local_5ec = (int)local_5c8;
                  local_5e8 = (int)local_908;
                  local_5e4 = context->user->instID[0];
                  local_5e0 = context->user->instPrimID[0];
                  ray->tfar = fVar142;
                  local_910 = -1;
                  local_770.valid = &local_910;
                  local_770.geometryUserPtr = pGVar5->userPtr;
                  local_770.context = context->user;
                  local_770.ray = (RTCRayN *)ray;
                  local_770.hit = (RTCHitN *)&local_600;
                  local_770.N = 1;
                  if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d6a4b8:
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar229 = ZEXT1664(auVar229._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      (*p_Var6)(&local_770);
                      if (*local_770.valid == 0) goto LAB_01d6a505;
                    }
                    bVar76 = 1;
                  }
                  else {
                    auVar229 = ZEXT1664(auVar92);
                    auVar242 = ZEXT1664(auVar87);
                    auVar245 = ZEXT1664(local_7a0._0_16_);
                    auVar249 = ZEXT1664(local_5a0._0_16_);
                    auVar252 = ZEXT1664(auVar91);
                    (*pGVar5->occlusionFilterN)(&local_770);
                    if (*local_770.valid != 0) goto LAB_01d6a4b8;
LAB_01d6a505:
                    ray->tfar = (float)local_900._0_4_;
                    bVar76 = 0;
                  }
                  auVar262 = ZEXT3264(local_640);
                  auVar260 = ZEXT3264(local_7e0);
                  auVar254 = ZEXT3264(local_800);
                  auVar255 = ZEXT3264(local_6a0);
                  auVar256 = ZEXT3264(local_6c0);
                  auVar257 = ZEXT3264(local_820);
                  auVar258 = ZEXT3264(local_6e0);
                  auVar259 = ZEXT3264(local_840);
                  auVar261 = ZEXT3264(local_700);
                  auVar263 = ZEXT3264(local_860);
                  auVar264 = ZEXT3264(local_720);
                  auVar265 = ZEXT3264(local_740);
                  auVar266 = ZEXT3264(local_7c0);
                  auVar267 = ZEXT3264(local_880);
                  goto LAB_01d6a29c;
                }
              }
              bVar82 = uVar80 < 4;
              uVar80 = uVar80 + 1;
            } while (uVar80 != 5);
            bVar82 = false;
            bVar76 = 5;
LAB_01d6a29c:
            bVar75 = bVar76;
            auVar236 = ZEXT3264(_local_8e0);
            auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar238 = ZEXT3264(_local_5c0);
LAB_01d6a2a5:
            bVar81 = (bool)(bVar81 | bVar82 & bVar75);
            fVar142 = ray->tfar;
            auVar158._4_4_ = fVar142;
            auVar158._0_4_ = fVar142;
            auVar158._8_4_ = fVar142;
            auVar158._12_4_ = fVar142;
            auVar158._16_4_ = fVar142;
            auVar158._20_4_ = fVar142;
            auVar158._24_4_ = fVar142;
            auVar158._28_4_ = fVar142;
            auVar73._4_4_ = fStack_39c;
            auVar73._0_4_ = local_3a0;
            auVar73._8_4_ = fStack_398;
            auVar73._12_4_ = fStack_394;
            auVar73._16_4_ = fStack_390;
            auVar73._20_4_ = fStack_38c;
            auVar73._24_4_ = fStack_388;
            auVar73._28_4_ = fStack_384;
            uVar17 = vcmpps_avx512vl(auVar158,auVar73,0xd);
            bVar77 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar77 & (byte)uVar17;
          } while (bVar77 != 0);
          auVar238 = ZEXT3264(local_320);
        }
        uVar19 = vpcmpgtd_avx512vl(local_3e0,local_360);
        uVar20 = vpcmpd_avx512vl(local_360,local_2a0,1);
        auVar199._0_4_ = auVar236._0_4_ + (float)local_2e0._0_4_;
        auVar199._4_4_ = auVar236._4_4_ + (float)local_2e0._4_4_;
        auVar199._8_4_ = auVar236._8_4_ + fStack_2d8;
        auVar199._12_4_ = auVar236._12_4_ + fStack_2d4;
        auVar199._16_4_ = auVar236._16_4_ + fStack_2d0;
        auVar199._20_4_ = auVar236._20_4_ + fStack_2cc;
        auVar199._24_4_ = auVar236._24_4_ + fStack_2c8;
        auVar199._28_4_ = auVar236._28_4_ + fStack_2c4;
        uVar17 = vcmpps_avx512vl(auVar199,auVar158,2);
        bVar77 = (byte)local_884 & (byte)uVar20 & (byte)uVar17;
        auVar200._0_4_ = auVar238._0_4_ + auVar236._0_4_;
        auVar200._4_4_ = auVar238._4_4_ + auVar236._4_4_;
        auVar200._8_4_ = auVar238._8_4_ + auVar236._8_4_;
        auVar200._12_4_ = auVar238._12_4_ + auVar236._12_4_;
        auVar200._16_4_ = auVar238._16_4_ + auVar236._16_4_;
        auVar200._20_4_ = auVar238._20_4_ + auVar236._20_4_;
        auVar200._24_4_ = auVar238._24_4_ + auVar236._24_4_;
        auVar200._28_4_ = auVar238._28_4_ + auVar236._28_4_;
        uVar17 = vcmpps_avx512vl(auVar200,auVar158,2);
        bVar74 = bVar74 & (byte)uVar19 & (byte)uVar17 | bVar77;
        prim = local_450;
        if (bVar74 != 0) {
          abStack_180[uVar79 * 0x60] = bVar74;
          auVar134._0_4_ =
               (uint)(bVar77 & 1) * local_2e0._0_4_ |
               (uint)!(bool)(bVar77 & 1) * (int)auVar238._0_4_;
          bVar82 = (bool)(bVar77 >> 1 & 1);
          auVar134._4_4_ = (uint)bVar82 * local_2e0._4_4_ | (uint)!bVar82 * (int)auVar238._4_4_;
          bVar82 = (bool)(bVar77 >> 2 & 1);
          auVar134._8_4_ = (uint)bVar82 * (int)fStack_2d8 | (uint)!bVar82 * (int)auVar238._8_4_;
          bVar82 = (bool)(bVar77 >> 3 & 1);
          auVar134._12_4_ = (uint)bVar82 * (int)fStack_2d4 | (uint)!bVar82 * (int)auVar238._12_4_;
          bVar82 = (bool)(bVar77 >> 4 & 1);
          auVar134._16_4_ = (uint)bVar82 * (int)fStack_2d0 | (uint)!bVar82 * (int)auVar238._16_4_;
          bVar82 = (bool)(bVar77 >> 5 & 1);
          auVar134._20_4_ = (uint)bVar82 * (int)fStack_2cc | (uint)!bVar82 * (int)auVar238._20_4_;
          bVar82 = (bool)(bVar77 >> 6 & 1);
          auVar134._24_4_ = (uint)bVar82 * (int)fStack_2c8 | (uint)!bVar82 * (int)auVar238._24_4_;
          auVar134._28_4_ =
               (uint)(bVar77 >> 7) * (int)fStack_2c4 |
               (uint)!(bool)(bVar77 >> 7) * (int)auVar238._28_4_;
          auVar238 = ZEXT3264(auVar134);
          *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar134;
          uVar80 = vmovlps_avx(local_370);
          (&uStack_140)[uVar79 * 0xc] = uVar80;
          aiStack_138[uVar79 * 0x18] = local_928 + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    fVar205 = ray->tfar;
    auVar154._4_4_ = fVar205;
    auVar154._0_4_ = fVar205;
    auVar154._8_4_ = fVar205;
    auVar154._12_4_ = fVar205;
    auVar154._16_4_ = fVar205;
    auVar154._20_4_ = fVar205;
    auVar154._24_4_ = fVar205;
    auVar154._28_4_ = fVar205;
    do {
      uVar84 = (uint)uVar79;
      uVar79 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        if (bVar81 != false) {
          return bVar81;
        }
        uVar17 = vcmpps_avx512vl(auVar154,local_280,0xd);
        uVar84 = (uint)local_448 & (uint)uVar17;
        local_448 = (ulong)uVar84;
        if (uVar84 == 0) {
          return false;
        }
        goto LAB_01d67f7d;
      }
      lVar78 = uVar79 * 0x60;
      auVar98 = *(undefined1 (*) [32])(auStack_160 + lVar78);
      auVar197._0_4_ = auVar236._0_4_ + auVar98._0_4_;
      auVar197._4_4_ = auVar236._4_4_ + auVar98._4_4_;
      auVar197._8_4_ = auVar236._8_4_ + auVar98._8_4_;
      auVar197._12_4_ = auVar236._12_4_ + auVar98._12_4_;
      auVar197._16_4_ = auVar236._16_4_ + auVar98._16_4_;
      auVar197._20_4_ = auVar236._20_4_ + auVar98._20_4_;
      auVar197._24_4_ = auVar236._24_4_ + auVar98._24_4_;
      auVar197._28_4_ = auVar236._28_4_ + auVar98._28_4_;
      uVar17 = vcmpps_avx512vl(auVar197,auVar154,2);
      uVar135 = (uint)uVar17 & (uint)abStack_180[lVar78];
    } while (uVar135 == 0);
    uVar80 = (&uStack_140)[uVar79 * 0xc];
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar80;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar198,auVar98);
    bVar74 = (byte)uVar135;
    auVar131._0_4_ =
         (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar98._0_4_;
    bVar82 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * (int)auVar98._4_4_;
    bVar82 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * (int)auVar98._8_4_;
    bVar82 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * (int)auVar98._12_4_;
    bVar82 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * (int)auVar98._16_4_;
    bVar82 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * (int)auVar98._20_4_;
    bVar82 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * (int)auVar98._24_4_;
    auVar131._28_4_ =
         (uVar135 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar98._28_4_;
    auVar98 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar98 = vminps_avx(auVar131,auVar98);
    auVar96 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar96);
    auVar96 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar96);
    uVar17 = vcmpps_avx512vl(auVar131,auVar98,0);
    bVar77 = (byte)uVar17 & bVar74;
    if (bVar77 != 0) {
      uVar135 = (uint)bVar77;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_928 = aiStack_138[uVar79 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar74;
    abStack_180[lVar78] = bVar74;
    if (bVar74 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar144 = (undefined4)uVar80;
    auVar177._4_4_ = uVar144;
    auVar177._0_4_ = uVar144;
    auVar177._8_4_ = uVar144;
    auVar177._12_4_ = uVar144;
    auVar177._16_4_ = uVar144;
    auVar177._20_4_ = uVar144;
    auVar177._24_4_ = uVar144;
    auVar177._28_4_ = uVar144;
    auVar87 = vmovshdup_avx(auVar146);
    auVar87 = vsubps_avx(auVar87,auVar146);
    auVar155._0_4_ = auVar87._0_4_;
    auVar155._4_4_ = auVar155._0_4_;
    auVar155._8_4_ = auVar155._0_4_;
    auVar155._12_4_ = auVar155._0_4_;
    auVar155._16_4_ = auVar155._0_4_;
    auVar155._20_4_ = auVar155._0_4_;
    auVar155._24_4_ = auVar155._0_4_;
    auVar155._28_4_ = auVar155._0_4_;
    auVar87 = vfmadd132ps_fma(auVar155,auVar177,_DAT_01faff20);
    _local_2e0 = ZEXT1632(auVar87);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar136 * 4);
    uVar79 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }